

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 uVar28;
  ulong uVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  undefined1 auVar64 [32];
  float fVar65;
  Geometry *pGVar66;
  byte bVar67;
  ulong uVar68;
  uint uVar69;
  uint uVar70;
  long lVar71;
  long lVar72;
  Geometry *pGVar73;
  uint uVar74;
  ulong uVar75;
  byte bVar76;
  ulong uVar77;
  float fVar78;
  float fVar79;
  float fVar132;
  float fVar134;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar133;
  float fVar135;
  float fVar137;
  float fVar138;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar91 [16];
  float fVar136;
  float fVar139;
  float fVar140;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined4 uVar141;
  float fVar157;
  float fVar158;
  vint4 bi_2;
  float fVar159;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined8 uVar160;
  vint4 bi_1;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  float fVar166;
  float fVar167;
  float fVar179;
  vint4 bi;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  vint4 ai_2;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  vint4 ai_1;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar210 [64];
  vint4 ai;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  float fVar218;
  float fVar219;
  undefined1 auVar217 [16];
  float fVar220;
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar230 [32];
  undefined1 auVar234 [64];
  undefined1 auVar235 [16];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  RTCFilterFunctionNArguments args;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  RTCFilterFunctionNArguments local_660;
  Geometry *local_630;
  undefined1 (*local_628) [32];
  undefined1 local_620 [32];
  LinearSpace3fa *local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  int local_39c;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar231 [32];
  
  PVar6 = prim[1];
  uVar68 = (ulong)(byte)PVar6;
  lVar30 = uVar68 * 0x25;
  fVar167 = *(float *)(prim + lVar30 + 0x12);
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar80 = vsubps_avx(auVar80,*(undefined1 (*) [16])(prim + lVar30 + 6));
  auVar180._0_4_ = fVar167 * auVar80._0_4_;
  auVar180._4_4_ = fVar167 * auVar80._4_4_;
  auVar180._8_4_ = fVar167 * auVar80._8_4_;
  auVar180._12_4_ = fVar167 * auVar80._12_4_;
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar91._0_4_ = fVar167 * auVar81._0_4_;
  auVar91._4_4_ = fVar167 * auVar81._4_4_;
  auVar91._8_4_ = fVar167 * auVar81._8_4_;
  auVar91._12_4_ = fVar167 * auVar81._12_4_;
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xf + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar68 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1a + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1b + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1c + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar199._4_4_ = auVar91._0_4_;
  auVar199._0_4_ = auVar91._0_4_;
  auVar199._8_4_ = auVar91._0_4_;
  auVar199._12_4_ = auVar91._0_4_;
  auVar27 = vshufps_avx(auVar91,auVar91,0x55);
  auVar85 = vshufps_avx(auVar91,auVar91,0xaa);
  fVar167 = auVar85._0_4_;
  auVar168._0_4_ = fVar167 * auVar89._0_4_;
  fVar157 = auVar85._4_4_;
  auVar168._4_4_ = fVar157 * auVar89._4_4_;
  fVar158 = auVar85._8_4_;
  auVar168._8_4_ = fVar158 * auVar89._8_4_;
  fVar159 = auVar85._12_4_;
  auVar168._12_4_ = fVar159 * auVar89._12_4_;
  auVar161._0_4_ = auVar23._0_4_ * fVar167;
  auVar161._4_4_ = auVar23._4_4_ * fVar157;
  auVar161._8_4_ = auVar23._8_4_ * fVar158;
  auVar161._12_4_ = auVar23._12_4_ * fVar159;
  auVar142._0_4_ = auVar26._0_4_ * fVar167;
  auVar142._4_4_ = auVar26._4_4_ * fVar157;
  auVar142._8_4_ = auVar26._8_4_ * fVar158;
  auVar142._12_4_ = auVar26._12_4_ * fVar159;
  auVar85 = vfmadd231ps_fma(auVar168,auVar27,auVar81);
  auVar86 = vfmadd231ps_fma(auVar161,auVar27,auVar22);
  auVar27 = vfmadd231ps_fma(auVar142,auVar25,auVar27);
  auVar87 = vfmadd231ps_fma(auVar85,auVar199,auVar80);
  auVar86 = vfmadd231ps_fma(auVar86,auVar199,auVar21);
  auVar88 = vfmadd231ps_fma(auVar27,auVar24,auVar199);
  auVar228._4_4_ = auVar180._0_4_;
  auVar228._0_4_ = auVar180._0_4_;
  auVar228._8_4_ = auVar180._0_4_;
  auVar228._12_4_ = auVar180._0_4_;
  auVar27 = vshufps_avx(auVar180,auVar180,0x55);
  auVar85 = vshufps_avx(auVar180,auVar180,0xaa);
  fVar167 = auVar85._0_4_;
  auVar200._0_4_ = fVar167 * auVar89._0_4_;
  fVar157 = auVar85._4_4_;
  auVar200._4_4_ = fVar157 * auVar89._4_4_;
  fVar158 = auVar85._8_4_;
  auVar200._8_4_ = fVar158 * auVar89._8_4_;
  fVar159 = auVar85._12_4_;
  auVar200._12_4_ = fVar159 * auVar89._12_4_;
  auVar190._0_4_ = auVar23._0_4_ * fVar167;
  auVar190._4_4_ = auVar23._4_4_ * fVar157;
  auVar190._8_4_ = auVar23._8_4_ * fVar158;
  auVar190._12_4_ = auVar23._12_4_ * fVar159;
  auVar181._0_4_ = auVar26._0_4_ * fVar167;
  auVar181._4_4_ = auVar26._4_4_ * fVar157;
  auVar181._8_4_ = auVar26._8_4_ * fVar158;
  auVar181._12_4_ = auVar26._12_4_ * fVar159;
  auVar81 = vfmadd231ps_fma(auVar200,auVar27,auVar81);
  auVar89 = vfmadd231ps_fma(auVar190,auVar27,auVar22);
  auVar22 = vfmadd231ps_fma(auVar181,auVar27,auVar25);
  auVar90 = vfmadd231ps_fma(auVar81,auVar228,auVar80);
  auVar91 = vfmadd231ps_fma(auVar89,auVar228,auVar21);
  auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar236 = ZEXT1664(auVar80);
  auVar142 = vfmadd231ps_fma(auVar22,auVar228,auVar24);
  auVar81 = vandps_avx512vl(auVar87,auVar80);
  auVar213._8_4_ = 0x219392ef;
  auVar213._0_8_ = 0x219392ef219392ef;
  auVar213._12_4_ = 0x219392ef;
  uVar75 = vcmpps_avx512vl(auVar81,auVar213,1);
  bVar14 = (bool)((byte)uVar75 & 1);
  auVar82._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar87._0_4_;
  bVar14 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar87._4_4_;
  bVar14 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar87._8_4_;
  bVar14 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar87._12_4_;
  auVar81 = vandps_avx512vl(auVar86,auVar80);
  uVar75 = vcmpps_avx512vl(auVar81,auVar213,1);
  bVar14 = (bool)((byte)uVar75 & 1);
  auVar83._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar86._0_4_;
  bVar14 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar86._4_4_;
  bVar14 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar86._8_4_;
  bVar14 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar86._12_4_;
  auVar80 = vandps_avx512vl(auVar88,auVar80);
  uVar75 = vcmpps_avx512vl(auVar80,auVar213,1);
  bVar14 = (bool)((byte)uVar75 & 1);
  auVar84._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar88._0_4_;
  bVar14 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar88._4_4_;
  bVar14 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar88._8_4_;
  bVar14 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar88._12_4_;
  auVar81 = vrcp14ps_avx512vl(auVar82);
  auVar214._8_4_ = 0x3f800000;
  auVar214._0_8_ = 0x3f8000003f800000;
  auVar214._12_4_ = 0x3f800000;
  auVar80 = vfnmadd213ps_fma(auVar82,auVar81,auVar214);
  auVar87 = vfmadd132ps_fma(auVar80,auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar83);
  auVar80 = vfnmadd213ps_fma(auVar83,auVar81,auVar214);
  auVar88 = vfmadd132ps_fma(auVar80,auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar84);
  auVar80 = vfnmadd213ps_fma(auVar84,auVar81,auVar214);
  auVar235 = vfmadd132ps_fma(auVar80,auVar81,auVar81);
  fVar167 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar30 + 0x16)) *
            *(float *)(prim + lVar30 + 0x1a);
  auVar211._4_4_ = fVar167;
  auVar211._0_4_ = fVar167;
  auVar211._8_4_ = fVar167;
  auVar211._12_4_ = fVar167;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar80 = vpmovsxwd_avx(auVar80);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar68 * 0xb + 6);
  auVar81 = vpmovsxwd_avx(auVar81);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar21 = vsubps_avx(auVar81,auVar80);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar81 = vpmovsxwd_avx(auVar89);
  auVar89 = vfmadd213ps_fma(auVar21,auVar211,auVar80);
  auVar80 = vcvtdq2ps_avx(auVar81);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar68 * 0xd + 6);
  auVar81 = vpmovsxwd_avx(auVar21);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar80);
  auVar21 = vfmadd213ps_fma(auVar81,auVar211,auVar80);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar68 * 0x12 + 6);
  auVar80 = vpmovsxwd_avx(auVar22);
  auVar80 = vcvtdq2ps_avx(auVar80);
  uVar75 = (ulong)(uint)((int)(uVar68 * 5) << 2);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar68 * 2 + uVar75 + 6);
  auVar81 = vpmovsxwd_avx(auVar23);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar80);
  auVar22 = vfmadd213ps_fma(auVar81,auVar211,auVar80);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar75 + 6);
  auVar80 = vpmovsxwd_avx(auVar24);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar68 * 0x18 + 6);
  auVar81 = vpmovsxwd_avx(auVar25);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar80);
  auVar23 = vfmadd213ps_fma(auVar81,auVar211,auVar80);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar68 * 0x1d + 6);
  auVar80 = vpmovsxwd_avx(auVar26);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar68 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar81 = vpmovsxwd_avx(auVar27);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar80);
  auVar24 = vfmadd213ps_fma(auVar81,auVar211,auVar80);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar68) + 6);
  auVar80 = vpmovsxwd_avx(auVar85);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar68 * 0x23 + 6);
  auVar81 = vpmovsxwd_avx(auVar86);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar80);
  auVar81 = vfmadd213ps_fma(auVar81,auVar211,auVar80);
  auVar80 = vsubps_avx(auVar89,auVar90);
  auVar212._0_4_ = auVar87._0_4_ * auVar80._0_4_;
  auVar212._4_4_ = auVar87._4_4_ * auVar80._4_4_;
  auVar212._8_4_ = auVar87._8_4_ * auVar80._8_4_;
  auVar212._12_4_ = auVar87._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar21,auVar90);
  auVar169._0_4_ = auVar87._0_4_ * auVar80._0_4_;
  auVar169._4_4_ = auVar87._4_4_ * auVar80._4_4_;
  auVar169._8_4_ = auVar87._8_4_ * auVar80._8_4_;
  auVar169._12_4_ = auVar87._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar22,auVar91);
  auVar201._0_4_ = auVar88._0_4_ * auVar80._0_4_;
  auVar201._4_4_ = auVar88._4_4_ * auVar80._4_4_;
  auVar201._8_4_ = auVar88._8_4_ * auVar80._8_4_;
  auVar201._12_4_ = auVar88._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar23,auVar91);
  auVar162._0_4_ = auVar88._0_4_ * auVar80._0_4_;
  auVar162._4_4_ = auVar88._4_4_ * auVar80._4_4_;
  auVar162._8_4_ = auVar88._8_4_ * auVar80._8_4_;
  auVar162._12_4_ = auVar88._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar24,auVar142);
  auVar191._0_4_ = auVar235._0_4_ * auVar80._0_4_;
  auVar191._4_4_ = auVar235._4_4_ * auVar80._4_4_;
  auVar191._8_4_ = auVar235._8_4_ * auVar80._8_4_;
  auVar191._12_4_ = auVar235._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar81,auVar142);
  auVar143._0_4_ = auVar235._0_4_ * auVar80._0_4_;
  auVar143._4_4_ = auVar235._4_4_ * auVar80._4_4_;
  auVar143._8_4_ = auVar235._8_4_ * auVar80._8_4_;
  auVar143._12_4_ = auVar235._12_4_ * auVar80._12_4_;
  auVar80 = vpminsd_avx(auVar212,auVar169);
  auVar81 = vpminsd_avx(auVar201,auVar162);
  auVar80 = vmaxps_avx(auVar80,auVar81);
  auVar81 = vpminsd_avx(auVar191,auVar143);
  uVar141 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar87._4_4_ = uVar141;
  auVar87._0_4_ = uVar141;
  auVar87._8_4_ = uVar141;
  auVar87._12_4_ = uVar141;
  auVar81 = vmaxps_avx512vl(auVar81,auVar87);
  auVar80 = vmaxps_avx(auVar80,auVar81);
  auVar88._8_4_ = 0x3f7ffffa;
  auVar88._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar88._12_4_ = 0x3f7ffffa;
  local_2d0 = vmulps_avx512vl(auVar80,auVar88);
  auVar80 = vpmaxsd_avx(auVar212,auVar169);
  auVar81 = vpmaxsd_avx(auVar201,auVar162);
  auVar80 = vminps_avx(auVar80,auVar81);
  auVar81 = vpmaxsd_avx(auVar191,auVar143);
  uVar141 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar235._4_4_ = uVar141;
  auVar235._0_4_ = uVar141;
  auVar235._8_4_ = uVar141;
  auVar235._12_4_ = uVar141;
  auVar81 = vminps_avx512vl(auVar81,auVar235);
  auVar80 = vminps_avx(auVar80,auVar81);
  auVar90._8_4_ = 0x3f800003;
  auVar90._0_8_ = 0x3f8000033f800003;
  auVar90._12_4_ = 0x3f800003;
  auVar80 = vmulps_avx512vl(auVar80,auVar90);
  auVar81 = vpbroadcastd_avx512vl();
  uVar160 = vcmpps_avx512vl(local_2d0,auVar80,2);
  uVar75 = vpcmpgtd_avx512vl(auVar81,_DAT_01f7fcf0);
  uVar75 = ((byte)uVar160 & 0xf) & uVar75;
  if ((char)uVar75 != '\0') {
    local_5e8 = pre->ray_space + k;
    local_628 = (undefined1 (*) [32])&local_140;
    local_2c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar237 = ZEXT464(0xbf800000);
    auVar80 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
    auVar238 = ZEXT1664(auVar80);
    do {
      lVar30 = 0;
      for (uVar68 = uVar75; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar74 = *(uint *)(prim + 2);
      uVar7 = *(uint *)(prim + lVar30 * 4 + 6);
      pGVar73 = (context->scene->geometries).items[uVar74].ptr;
      uVar68 = (ulong)*(uint *)(*(long *)&pGVar73->field_0x58 +
                               (ulong)uVar7 *
                               pGVar73[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar167 = (pGVar73->time_range).lower;
      fVar167 = pGVar73->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar167) /
                ((pGVar73->time_range).upper - fVar167));
      auVar80 = vroundss_avx(ZEXT416((uint)fVar167),ZEXT416((uint)fVar167),9);
      auVar81 = vaddss_avx512f(ZEXT416((uint)pGVar73->fnumTimeSegments),auVar237._0_16_);
      auVar80 = vminss_avx(auVar80,auVar81);
      auVar80 = vmaxss_avx(ZEXT816(0) << 0x20,auVar80);
      fVar167 = fVar167 - auVar80._0_4_;
      fVar157 = 1.0 - fVar167;
      _Var10 = pGVar73[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar71 = (long)(int)auVar80._0_4_ * 0x38;
      lVar72 = *(long *)(_Var10 + 0x10 + lVar71);
      lVar11 = *(long *)(_Var10 + 0x38 + lVar71);
      lVar12 = *(long *)(_Var10 + 0x48 + lVar71);
      auVar144._4_4_ = fVar167;
      auVar144._0_4_ = fVar167;
      auVar144._8_4_ = fVar167;
      auVar144._12_4_ = fVar167;
      pfVar3 = (float *)(lVar11 + lVar12 * uVar68);
      auVar217._0_4_ = fVar167 * *pfVar3;
      auVar217._4_4_ = fVar167 * pfVar3[1];
      auVar217._8_4_ = fVar167 * pfVar3[2];
      auVar217._12_4_ = fVar167 * pfVar3[3];
      lVar30 = uVar68 + 1;
      auVar80 = vmulps_avx512vl(auVar144,*(undefined1 (*) [16])(lVar11 + lVar12 * lVar30));
      p_Var13 = pGVar73[4].occlusionFilterN;
      auVar163._4_4_ = fVar157;
      auVar163._0_4_ = fVar157;
      auVar163._8_4_ = fVar157;
      auVar163._12_4_ = fVar157;
      auVar21 = vfmadd231ps_fma(auVar217,auVar163,
                                *(undefined1 (*) [16])(*(long *)(_Var10 + lVar71) + lVar72 * uVar68)
                               );
      auVar85 = vfmadd231ps_avx512vl
                          (auVar80,auVar163,
                           *(undefined1 (*) [16])(*(long *)(_Var10 + lVar71) + lVar72 * lVar30));
      pfVar3 = (float *)(*(long *)(p_Var13 + lVar71 + 0x38) +
                        uVar68 * *(long *)(p_Var13 + lVar71 + 0x48));
      auVar221._0_4_ = fVar167 * *pfVar3;
      auVar221._4_4_ = fVar167 * pfVar3[1];
      auVar221._8_4_ = fVar167 * pfVar3[2];
      auVar221._12_4_ = fVar167 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var13 + lVar71 + 0x38) +
                        *(long *)(p_Var13 + lVar71 + 0x48) * lVar30);
      auVar225._0_4_ = fVar167 * *pfVar3;
      auVar225._4_4_ = fVar167 * pfVar3[1];
      auVar225._8_4_ = fVar167 * pfVar3[2];
      auVar225._12_4_ = fVar167 * pfVar3[3];
      auVar81 = vfmadd231ps_fma(auVar221,auVar163,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var13 + lVar71) +
                                 *(long *)(p_Var13 + lVar71 + 0x10) * uVar68));
      auVar89 = vfmadd231ps_fma(auVar225,auVar163,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var13 + lVar71) +
                                 *(long *)(p_Var13 + lVar71 + 0x10) * lVar30));
      iVar8 = (int)pGVar73[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      lVar30 = (long)iVar8 * 0x44;
      auVar86 = vfnmadd213ps_avx512vl(auVar81,auVar238._0_16_,auVar21);
      auVar87 = vfmadd213ps_avx512vl(auVar89,auVar238._0_16_,auVar85);
      auVar89 = vsubps_avx(auVar21,auVar80);
      uVar141 = auVar89._0_4_;
      auVar170._4_4_ = uVar141;
      auVar170._0_4_ = uVar141;
      auVar170._8_4_ = uVar141;
      auVar170._12_4_ = uVar141;
      auVar81 = vshufps_avx(auVar89,auVar89,0x55);
      aVar4 = (local_5e8->vx).field_0;
      aVar5 = (local_5e8->vy).field_0;
      fVar167 = (local_5e8->vz).field_0.m128[0];
      fVar157 = *(float *)((long)&(local_5e8->vz).field_0 + 4);
      fVar158 = *(float *)((long)&(local_5e8->vz).field_0 + 8);
      fVar159 = *(float *)((long)&(local_5e8->vz).field_0 + 0xc);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar224._0_4_ = fVar167 * auVar89._0_4_;
      auVar224._4_4_ = fVar157 * auVar89._4_4_;
      auVar224._8_4_ = fVar158 * auVar89._8_4_;
      auVar224._12_4_ = fVar159 * auVar89._12_4_;
      auVar81 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar5,auVar81);
      auVar22 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar170);
      auVar89 = vsubps_avx(auVar86,auVar80);
      uVar141 = auVar89._0_4_;
      auVar171._4_4_ = uVar141;
      auVar171._0_4_ = uVar141;
      auVar171._8_4_ = uVar141;
      auVar171._12_4_ = uVar141;
      auVar81 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar226._0_4_ = fVar167 * auVar89._0_4_;
      auVar226._4_4_ = fVar157 * auVar89._4_4_;
      auVar226._8_4_ = fVar158 * auVar89._8_4_;
      auVar226._12_4_ = fVar159 * auVar89._12_4_;
      auVar81 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar5,auVar81);
      auVar23 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar171);
      auVar89 = vsubps_avx(auVar87,auVar80);
      uVar141 = auVar89._0_4_;
      auVar172._4_4_ = uVar141;
      auVar172._0_4_ = uVar141;
      auVar172._8_4_ = uVar141;
      auVar172._12_4_ = uVar141;
      auVar81 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar227._0_4_ = fVar167 * auVar89._0_4_;
      auVar227._4_4_ = fVar157 * auVar89._4_4_;
      auVar227._8_4_ = fVar158 * auVar89._8_4_;
      auVar227._12_4_ = fVar159 * auVar89._12_4_;
      auVar81 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar5,auVar81);
      auVar89 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar172);
      auVar81 = vsubps_avx512vl(auVar85,auVar80);
      uVar141 = auVar81._0_4_;
      auVar164._4_4_ = uVar141;
      auVar164._0_4_ = uVar141;
      auVar164._8_4_ = uVar141;
      auVar164._12_4_ = uVar141;
      auVar80 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar229._0_4_ = fVar167 * auVar81._0_4_;
      auVar229._4_4_ = fVar157 * auVar81._4_4_;
      auVar229._8_4_ = fVar158 * auVar81._8_4_;
      auVar229._12_4_ = fVar159 * auVar81._12_4_;
      auVar80 = vfmadd231ps_fma(auVar229,(undefined1  [16])aVar5,auVar80);
      auVar24 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar4,auVar164);
      auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar30);
      uVar141 = auVar22._0_4_;
      local_420._4_4_ = uVar141;
      local_420._0_4_ = uVar141;
      local_420._8_4_ = uVar141;
      local_420._12_4_ = uVar141;
      local_420._16_4_ = uVar141;
      local_420._20_4_ = uVar141;
      local_420._24_4_ = uVar141;
      local_420._28_4_ = uVar141;
      auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x484);
      auVar92._8_4_ = 1;
      auVar92._0_8_ = 0x100000001;
      auVar92._12_4_ = 1;
      auVar92._16_4_ = 1;
      auVar92._20_4_ = 1;
      auVar92._24_4_ = 1;
      auVar92._28_4_ = 1;
      local_440 = vpermps_avx2(auVar92,ZEXT1632(auVar22));
      uVar141 = auVar23._0_4_;
      auVar182._4_4_ = uVar141;
      auVar182._0_4_ = uVar141;
      auVar182._8_4_ = uVar141;
      auVar182._12_4_ = uVar141;
      local_460._16_4_ = uVar141;
      local_460._0_16_ = auVar182;
      local_460._20_4_ = uVar141;
      local_460._24_4_ = uVar141;
      local_460._28_4_ = uVar141;
      local_480 = vpermps_avx512vl(auVar92,ZEXT1632(auVar23));
      auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x908);
      local_4a0 = vbroadcastss_avx512vl(auVar89);
      local_4c0 = vpermps_avx512vl(auVar92,ZEXT1632(auVar89));
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0xd8c);
      uVar141 = auVar24._0_4_;
      local_4e0._4_4_ = uVar141;
      local_4e0._0_4_ = uVar141;
      fStack_4d8 = (float)uVar141;
      fStack_4d4 = (float)uVar141;
      fStack_4d0 = (float)uVar141;
      fStack_4cc = (float)uVar141;
      fStack_4c8 = (float)uVar141;
      register0x0000139c = uVar141;
      _local_500 = vpermps_avx512vl(auVar92,ZEXT1632(auVar24));
      auVar92 = vmulps_avx512vl(_local_4e0,auVar104);
      auVar93 = vmulps_avx512vl(_local_500,auVar104);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar105,local_4a0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar105,local_4c0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar107,local_460);
      auVar94 = vfmadd231ps_avx512vl(auVar93,auVar107,local_480);
      auVar95 = vfmadd231ps_avx512vl(auVar92,auVar106,local_420);
      auVar210 = ZEXT3264(auVar95);
      auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar30);
      auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x484);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x908);
      auVar96 = vfmadd231ps_avx512vl(auVar94,auVar106,local_440);
      auVar198 = ZEXT3264(auVar96);
      auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0xd8c);
      auVar97 = vmulps_avx512vl(_local_4e0,auVar94);
      auVar98 = vmulps_avx512vl(_local_500,auVar94);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar103,local_4a0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,local_4c0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_460);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_480);
      auVar25 = vfmadd231ps_fma(auVar97,auVar92,local_420);
      auVar215 = ZEXT1664(auVar25);
      auVar26 = vfmadd231ps_fma(auVar98,auVar92,local_440);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar25),auVar95);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar26),auVar96);
      auVar99 = vmulps_avx512vl(auVar96,auVar97);
      auVar100 = vmulps_avx512vl(auVar95,auVar98);
      auVar99 = vsubps_avx512vl(auVar99,auVar100);
      auVar80 = vshufps_avx(auVar21,auVar21,0xff);
      uVar160 = auVar80._0_8_;
      local_80._8_8_ = uVar160;
      local_80._0_8_ = uVar160;
      local_80._16_8_ = uVar160;
      local_80._24_8_ = uVar160;
      auVar80 = vshufps_avx(auVar86,auVar86,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar80);
      auVar80 = vshufps_avx(auVar87,auVar87,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar80);
      auVar80 = vshufps_avx512vl(auVar85,auVar85,0xff);
      uVar160 = auVar80._0_8_;
      local_e0._8_8_ = uVar160;
      local_e0._0_8_ = uVar160;
      local_e0._16_8_ = uVar160;
      local_e0._24_8_ = uVar160;
      auVar100 = vmulps_avx512vl(local_e0,auVar104);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar105,local_c0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar107,local_a0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,local_80);
      auVar101 = vmulps_avx512vl(local_e0,auVar94);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar103,local_c0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar93,local_a0);
      auVar27 = vfmadd231ps_fma(auVar101,auVar92,local_80);
      auVar101 = vmulps_avx512vl(auVar98,auVar98);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar97);
      auVar102 = vmaxps_avx512vl(auVar100,ZEXT1632(auVar27));
      auVar102 = vmulps_avx512vl(auVar102,auVar102);
      auVar101 = vmulps_avx512vl(auVar102,auVar101);
      auVar99 = vmulps_avx512vl(auVar99,auVar99);
      uVar160 = vcmpps_avx512vl(auVar99,auVar101,2);
      auVar80 = vblendps_avx(auVar22,auVar21,8);
      auVar235 = auVar236._0_16_;
      auVar81 = vandps_avx512vl(auVar80,auVar235);
      auVar80 = vblendps_avx(auVar23,auVar86,8);
      auVar80 = vandps_avx512vl(auVar80,auVar235);
      auVar81 = vmaxps_avx(auVar81,auVar80);
      auVar80 = vblendps_avx(auVar89,auVar87,8);
      auVar88 = vandps_avx512vl(auVar80,auVar235);
      auVar80 = vblendps_avx(auVar24,auVar85,8);
      auVar80 = vandps_avx512vl(auVar80,auVar235);
      auVar80 = vmaxps_avx(auVar88,auVar80);
      auVar80 = vmaxps_avx(auVar81,auVar80);
      auVar81 = vmovshdup_avx(auVar80);
      auVar81 = vmaxss_avx(auVar81,auVar80);
      auVar80 = vshufpd_avx(auVar80,auVar80,1);
      auVar80 = vmaxss_avx(auVar80,auVar81);
      auVar81 = vcvtsi2ss_avx512f(auVar235,iVar8);
      local_580._0_16_ = auVar81;
      auVar101._0_4_ = auVar81._0_4_;
      auVar101._4_4_ = auVar101._0_4_;
      auVar101._8_4_ = auVar101._0_4_;
      auVar101._12_4_ = auVar101._0_4_;
      auVar101._16_4_ = auVar101._0_4_;
      auVar101._20_4_ = auVar101._0_4_;
      auVar101._24_4_ = auVar101._0_4_;
      auVar101._28_4_ = auVar101._0_4_;
      uVar28 = vcmpps_avx512vl(auVar101,_DAT_01faff40,0xe);
      bVar76 = (byte)uVar160 & (byte)uVar28;
      fVar167 = auVar80._0_4_ * 4.7683716e-07;
      local_5c0._0_16_ = ZEXT416((uint)fVar167);
      auVar99._8_4_ = 2;
      auVar99._0_8_ = 0x200000002;
      auVar99._12_4_ = 2;
      auVar99._16_4_ = 2;
      auVar99._20_4_ = 2;
      auVar99._24_4_ = 2;
      auVar99._28_4_ = 2;
      local_240 = vpermps_avx2(auVar99,ZEXT1632(auVar22));
      local_260 = vpermps_avx2(auVar99,ZEXT1632(auVar23));
      local_280 = vpermps_avx2(auVar99,ZEXT1632(auVar89));
      local_2a0 = vpermps_avx2(auVar99,ZEXT1632(auVar24));
      local_560 = *(undefined4 *)(ray + k * 4 + 0x60);
      uStack_55c = 0;
      uStack_558 = 0;
      uStack_554 = 0;
      local_670 = auVar21._0_8_;
      uStack_668 = auVar21._8_8_;
      local_690 = auVar86._0_8_;
      uStack_688 = auVar86._8_8_;
      local_6a0 = auVar87._0_8_;
      uStack_698 = auVar87._8_8_;
      local_680._0_4_ = auVar85._0_4_;
      fVar157 = (float)local_680;
      local_680._4_4_ = auVar85._4_4_;
      fVar158 = local_680._4_4_;
      uStack_678._0_4_ = auVar85._8_4_;
      fVar159 = (float)uStack_678;
      uStack_678._4_4_ = auVar85._12_4_;
      fVar65 = uStack_678._4_4_;
      local_680 = auVar85._0_8_;
      uStack_678 = auVar85._8_8_;
      if (bVar76 != 0) {
        auVar94 = vmulps_avx512vl(local_2a0,auVar94);
        auVar103 = vfmadd213ps_avx512vl(auVar103,local_280,auVar94);
        auVar93 = vfmadd213ps_avx512vl(auVar93,local_260,auVar103);
        auVar94 = vfmadd213ps_avx512vl(auVar92,local_240,auVar93);
        auVar104 = vmulps_avx512vl(local_2a0,auVar104);
        auVar105 = vfmadd213ps_avx512vl(auVar105,local_280,auVar104);
        auVar93 = vfmadd213ps_avx512vl(auVar107,local_260,auVar105);
        auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1210);
        auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1694);
        auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1b18);
        auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1f9c);
        auVar99 = vfmadd213ps_avx512vl(auVar106,local_240,auVar93);
        auVar106 = vmulps_avx512vl(_local_4e0,auVar92);
        auVar93 = vmulps_avx512vl(_local_500,auVar92);
        auVar92 = vmulps_avx512vl(local_2a0,auVar92);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar104,local_4a0);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar104,local_4c0);
        auVar104 = vfmadd231ps_avx512vl(auVar92,local_280,auVar104);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar105,local_460);
        auVar92 = vfmadd231ps_avx512vl(auVar93,auVar105,local_480);
        auVar93 = vfmadd231ps_avx512vl(auVar104,local_260,auVar105);
        auVar80 = vfmadd231ps_fma(auVar106,auVar107,local_420);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar107,local_440);
        auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1210);
        auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1b18);
        auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1f9c);
        auVar93 = vfmadd231ps_avx512vl(auVar93,local_240,auVar107);
        auVar107 = vmulps_avx512vl(_local_4e0,auVar104);
        auVar103 = vmulps_avx512vl(_local_500,auVar104);
        auVar104 = vmulps_avx512vl(local_2a0,auVar104);
        auVar102 = vfmadd231ps_avx512vl(auVar107,auVar105,local_4a0);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar105,local_4c0);
        auVar105 = vfmadd231ps_avx512vl(auVar104,local_280,auVar105);
        auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1694);
        auVar104 = vfmadd231ps_avx512vl(auVar102,auVar107,local_460);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,local_480);
        auVar107 = vfmadd231ps_avx512vl(auVar105,local_260,auVar107);
        auVar81 = vfmadd231ps_fma(auVar104,auVar106,local_420);
        auVar105 = vfmadd231ps_avx512vl(auVar103,auVar106,local_440);
        auVar104 = vfmadd231ps_avx512vl(auVar107,local_240,auVar106);
        auVar237 = ZEXT1664(auVar237._0_16_);
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
        auVar238 = ZEXT1664(auVar89);
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar236 = ZEXT1664(auVar89);
        auVar230._8_4_ = 0x7fffffff;
        auVar230._0_8_ = 0x7fffffff7fffffff;
        auVar230._12_4_ = 0x7fffffff;
        auVar230._16_4_ = 0x7fffffff;
        auVar230._20_4_ = 0x7fffffff;
        auVar230._24_4_ = 0x7fffffff;
        auVar230._28_4_ = 0x7fffffff;
        auVar106 = vandps_avx(ZEXT1632(auVar80),auVar230);
        auVar107 = vandps_avx(auVar92,auVar230);
        auVar107 = vmaxps_avx(auVar106,auVar107);
        auVar106 = vandps_avx(auVar93,auVar230);
        auVar106 = vmaxps_avx(auVar107,auVar106);
        auVar222._4_4_ = fVar167;
        auVar222._0_4_ = fVar167;
        auVar222._8_4_ = fVar167;
        auVar222._12_4_ = fVar167;
        auVar222._16_4_ = fVar167;
        auVar222._20_4_ = fVar167;
        auVar222._24_4_ = fVar167;
        auVar222._28_4_ = fVar167;
        uVar68 = vcmpps_avx512vl(auVar106,auVar222,1);
        bVar14 = (bool)((byte)uVar68 & 1);
        auVar102._0_4_ = (float)((uint)bVar14 * auVar97._0_4_ | (uint)!bVar14 * auVar80._0_4_);
        bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar14 * auVar97._4_4_ | (uint)!bVar14 * auVar80._4_4_);
        bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar14 * auVar97._8_4_ | (uint)!bVar14 * auVar80._8_4_);
        bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar14 * auVar97._12_4_ | (uint)!bVar14 * auVar80._12_4_);
        fVar167 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar97._16_4_);
        auVar102._16_4_ = fVar167;
        fVar218 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar97._20_4_);
        auVar102._20_4_ = fVar218;
        fVar219 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar97._24_4_);
        auVar102._24_4_ = fVar219;
        auVar102._28_4_ = (uint)(byte)(uVar68 >> 7) * auVar97._28_4_;
        bVar14 = (bool)((byte)uVar68 & 1);
        auVar108._0_4_ = (float)((uint)bVar14 * auVar98._0_4_ | (uint)!bVar14 * auVar92._0_4_);
        bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * auVar92._4_4_);
        bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * auVar92._8_4_);
        bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * auVar92._12_4_);
        bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar108._16_4_ = (float)((uint)bVar14 * auVar98._16_4_ | (uint)!bVar14 * auVar92._16_4_);
        bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar108._20_4_ = (float)((uint)bVar14 * auVar98._20_4_ | (uint)!bVar14 * auVar92._20_4_);
        bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar108._24_4_ = (float)((uint)bVar14 * auVar98._24_4_ | (uint)!bVar14 * auVar92._24_4_);
        bVar14 = SUB81(uVar68 >> 7,0);
        auVar108._28_4_ = (uint)bVar14 * auVar98._28_4_ | (uint)!bVar14 * auVar92._28_4_;
        auVar106 = vandps_avx(auVar230,ZEXT1632(auVar81));
        auVar107 = vandps_avx(auVar105,auVar230);
        auVar107 = vmaxps_avx(auVar106,auVar107);
        auVar106 = vandps_avx(auVar104,auVar230);
        auVar106 = vmaxps_avx(auVar107,auVar106);
        uVar68 = vcmpps_avx512vl(auVar106,auVar222,1);
        bVar14 = (bool)((byte)uVar68 & 1);
        auVar109._0_4_ = (float)((uint)bVar14 * auVar97._0_4_ | (uint)!bVar14 * auVar81._0_4_);
        bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar14 * auVar97._4_4_ | (uint)!bVar14 * auVar81._4_4_);
        bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar14 * auVar97._8_4_ | (uint)!bVar14 * auVar81._8_4_);
        bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar14 * auVar97._12_4_ | (uint)!bVar14 * auVar81._12_4_);
        fVar220 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar97._16_4_);
        auVar109._16_4_ = fVar220;
        fVar166 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar97._20_4_);
        auVar109._20_4_ = fVar166;
        fVar179 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar97._24_4_);
        auVar109._24_4_ = fVar179;
        uVar69 = (uint)(byte)(uVar68 >> 7) * auVar97._28_4_;
        auVar109._28_4_ = uVar69;
        bVar14 = (bool)((byte)uVar68 & 1);
        auVar110._0_4_ = (float)((uint)bVar14 * auVar98._0_4_ | (uint)!bVar14 * auVar105._0_4_);
        bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * auVar105._4_4_);
        bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * auVar105._8_4_);
        bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * auVar105._12_4_);
        bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar14 * auVar98._16_4_ | (uint)!bVar14 * auVar105._16_4_);
        bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar14 * auVar98._20_4_ | (uint)!bVar14 * auVar105._20_4_);
        bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar14 * auVar98._24_4_ | (uint)!bVar14 * auVar105._24_4_);
        bVar14 = SUB81(uVar68 >> 7,0);
        auVar110._28_4_ = (uint)bVar14 * auVar98._28_4_ | (uint)!bVar14 * auVar105._28_4_;
        auVar90 = vxorps_avx512vl(auVar182,auVar182);
        auVar106 = vfmadd213ps_avx512vl(auVar102,auVar102,ZEXT1632(auVar90));
        auVar80 = vfmadd231ps_fma(auVar106,auVar108,auVar108);
        auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
        fVar78 = auVar107._0_4_;
        fVar79 = auVar107._4_4_;
        fVar132 = auVar107._8_4_;
        fVar133 = auVar107._12_4_;
        fVar134 = auVar107._16_4_;
        fVar135 = auVar107._20_4_;
        fVar137 = auVar107._24_4_;
        auVar106._4_4_ = fVar79 * fVar79 * fVar79 * auVar80._4_4_ * -0.5;
        auVar106._0_4_ = fVar78 * fVar78 * fVar78 * auVar80._0_4_ * -0.5;
        auVar106._8_4_ = fVar132 * fVar132 * fVar132 * auVar80._8_4_ * -0.5;
        auVar106._12_4_ = fVar133 * fVar133 * fVar133 * auVar80._12_4_ * -0.5;
        auVar106._16_4_ = fVar134 * fVar134 * fVar134 * -0.0;
        auVar106._20_4_ = fVar135 * fVar135 * fVar135 * -0.0;
        auVar106._24_4_ = fVar137 * fVar137 * fVar137 * -0.0;
        auVar106._28_4_ = auVar104._28_4_;
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar92,auVar107);
        auVar107._4_4_ = auVar108._4_4_ * auVar106._4_4_;
        auVar107._0_4_ = auVar108._0_4_ * auVar106._0_4_;
        auVar107._8_4_ = auVar108._8_4_ * auVar106._8_4_;
        auVar107._12_4_ = auVar108._12_4_ * auVar106._12_4_;
        auVar107._16_4_ = auVar108._16_4_ * auVar106._16_4_;
        auVar107._20_4_ = auVar108._20_4_ * auVar106._20_4_;
        auVar107._24_4_ = auVar108._24_4_ * auVar106._24_4_;
        auVar107._28_4_ = 0;
        auVar105._4_4_ = auVar106._4_4_ * -auVar102._4_4_;
        auVar105._0_4_ = auVar106._0_4_ * -auVar102._0_4_;
        auVar105._8_4_ = auVar106._8_4_ * -auVar102._8_4_;
        auVar105._12_4_ = auVar106._12_4_ * -auVar102._12_4_;
        auVar105._16_4_ = auVar106._16_4_ * -fVar167;
        auVar105._20_4_ = auVar106._20_4_ * -fVar218;
        auVar105._24_4_ = auVar106._24_4_ * -fVar219;
        auVar105._28_4_ = auVar108._28_4_;
        auVar106 = vmulps_avx512vl(auVar106,ZEXT1632(auVar90));
        auVar98 = ZEXT1632(auVar90);
        auVar104 = vfmadd213ps_avx512vl(auVar109,auVar109,auVar98);
        auVar80 = vfmadd231ps_fma(auVar104,auVar110,auVar110);
        auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
        fVar167 = auVar103._0_4_;
        fVar218 = auVar103._4_4_;
        fVar219 = auVar103._8_4_;
        fVar78 = auVar103._12_4_;
        fVar79 = auVar103._16_4_;
        fVar132 = auVar103._20_4_;
        fVar133 = auVar103._24_4_;
        auVar104._4_4_ = fVar218 * fVar218 * fVar218 * auVar80._4_4_ * -0.5;
        auVar104._0_4_ = fVar167 * fVar167 * fVar167 * auVar80._0_4_ * -0.5;
        auVar104._8_4_ = fVar219 * fVar219 * fVar219 * auVar80._8_4_ * -0.5;
        auVar104._12_4_ = fVar78 * fVar78 * fVar78 * auVar80._12_4_ * -0.5;
        auVar104._16_4_ = fVar79 * fVar79 * fVar79 * -0.0;
        auVar104._20_4_ = fVar132 * fVar132 * fVar132 * -0.0;
        auVar104._24_4_ = fVar133 * fVar133 * fVar133 * -0.0;
        auVar104._28_4_ = 0;
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar92,auVar103);
        auVar93._4_4_ = auVar110._4_4_ * auVar104._4_4_;
        auVar93._0_4_ = auVar110._0_4_ * auVar104._0_4_;
        auVar93._8_4_ = auVar110._8_4_ * auVar104._8_4_;
        auVar93._12_4_ = auVar110._12_4_ * auVar104._12_4_;
        auVar93._16_4_ = auVar110._16_4_ * auVar104._16_4_;
        auVar93._20_4_ = auVar110._20_4_ * auVar104._20_4_;
        auVar93._24_4_ = auVar110._24_4_ * auVar104._24_4_;
        auVar93._28_4_ = auVar103._28_4_;
        auVar103._4_4_ = -auVar109._4_4_ * auVar104._4_4_;
        auVar103._0_4_ = -auVar109._0_4_ * auVar104._0_4_;
        auVar103._8_4_ = -auVar109._8_4_ * auVar104._8_4_;
        auVar103._12_4_ = -auVar109._12_4_ * auVar104._12_4_;
        auVar103._16_4_ = -fVar220 * auVar104._16_4_;
        auVar103._20_4_ = -fVar166 * auVar104._20_4_;
        auVar103._24_4_ = -fVar179 * auVar104._24_4_;
        auVar103._28_4_ = uVar69 ^ 0x80000000;
        auVar104 = vmulps_avx512vl(auVar104,auVar98);
        auVar80 = vfmadd213ps_fma(auVar107,auVar100,auVar95);
        auVar81 = vfmadd213ps_fma(auVar105,auVar100,auVar96);
        auVar92 = vfmadd213ps_avx512vl(auVar106,auVar100,auVar99);
        auVar97 = vfmadd213ps_avx512vl(auVar93,ZEXT1632(auVar27),ZEXT1632(auVar25));
        auVar85 = vfnmadd213ps_fma(auVar107,auVar100,auVar95);
        auVar95 = ZEXT1632(auVar27);
        auVar89 = vfmadd213ps_fma(auVar103,auVar95,ZEXT1632(auVar26));
        auVar88 = vfnmadd213ps_fma(auVar105,auVar100,auVar96);
        auVar22 = vfmadd213ps_fma(auVar104,auVar95,auVar94);
        auVar107 = vfnmadd231ps_avx512vl(auVar99,auVar100,auVar106);
        auVar25 = vfnmadd213ps_fma(auVar93,auVar95,ZEXT1632(auVar25));
        auVar26 = vfnmadd213ps_fma(auVar103,auVar95,ZEXT1632(auVar26));
        auVar235 = vfnmadd231ps_fma(auVar94,ZEXT1632(auVar27),auVar104);
        auVar105 = vsubps_avx512vl(auVar97,ZEXT1632(auVar85));
        auVar106 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar88));
        auVar104 = vsubps_avx512vl(ZEXT1632(auVar22),auVar107);
        auVar93 = vmulps_avx512vl(auVar106,auVar107);
        auVar23 = vfmsub231ps_fma(auVar93,ZEXT1632(auVar88),auVar104);
        auVar94._4_4_ = auVar85._4_4_ * auVar104._4_4_;
        auVar94._0_4_ = auVar85._0_4_ * auVar104._0_4_;
        auVar94._8_4_ = auVar85._8_4_ * auVar104._8_4_;
        auVar94._12_4_ = auVar85._12_4_ * auVar104._12_4_;
        auVar94._16_4_ = auVar104._16_4_ * 0.0;
        auVar94._20_4_ = auVar104._20_4_ * 0.0;
        auVar94._24_4_ = auVar104._24_4_ * 0.0;
        auVar94._28_4_ = auVar104._28_4_;
        auVar104 = vfmsub231ps_avx512vl(auVar94,auVar107,auVar105);
        auVar95._4_4_ = auVar88._4_4_ * auVar105._4_4_;
        auVar95._0_4_ = auVar88._0_4_ * auVar105._0_4_;
        auVar95._8_4_ = auVar88._8_4_ * auVar105._8_4_;
        auVar95._12_4_ = auVar88._12_4_ * auVar105._12_4_;
        auVar95._16_4_ = auVar105._16_4_ * 0.0;
        auVar95._20_4_ = auVar105._20_4_ * 0.0;
        auVar95._24_4_ = auVar105._24_4_ * 0.0;
        auVar95._28_4_ = auVar105._28_4_;
        auVar24 = vfmsub231ps_fma(auVar95,ZEXT1632(auVar85),auVar106);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar24),auVar98,auVar104);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar98,ZEXT1632(auVar23));
        auVar99 = ZEXT1632(auVar90);
        uVar68 = vcmpps_avx512vl(auVar106,auVar99,2);
        bVar67 = (byte)uVar68;
        fVar78 = (float)((uint)(bVar67 & 1) * auVar80._0_4_ |
                        (uint)!(bool)(bVar67 & 1) * auVar25._0_4_);
        bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
        fVar132 = (float)((uint)bVar14 * auVar80._4_4_ | (uint)!bVar14 * auVar25._4_4_);
        bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
        fVar134 = (float)((uint)bVar14 * auVar80._8_4_ | (uint)!bVar14 * auVar25._8_4_);
        bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
        fVar137 = (float)((uint)bVar14 * auVar80._12_4_ | (uint)!bVar14 * auVar25._12_4_);
        auVar103 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar134,CONCAT44(fVar132,fVar78))));
        fVar79 = (float)((uint)(bVar67 & 1) * auVar81._0_4_ |
                        (uint)!(bool)(bVar67 & 1) * auVar26._0_4_);
        bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
        fVar133 = (float)((uint)bVar14 * auVar81._4_4_ | (uint)!bVar14 * auVar26._4_4_);
        bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
        fVar135 = (float)((uint)bVar14 * auVar81._8_4_ | (uint)!bVar14 * auVar26._8_4_);
        bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
        fVar138 = (float)((uint)bVar14 * auVar81._12_4_ | (uint)!bVar14 * auVar26._12_4_);
        auVar94 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar135,CONCAT44(fVar133,fVar79))));
        auVar111._0_4_ =
             (float)((uint)(bVar67 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar235._0_4_
                    );
        bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar14 * auVar92._4_4_ | (uint)!bVar14 * auVar235._4_4_);
        bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar14 * auVar92._8_4_ | (uint)!bVar14 * auVar235._8_4_);
        bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar14 * auVar92._12_4_ | (uint)!bVar14 * auVar235._12_4_);
        fVar219 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar92._16_4_);
        auVar111._16_4_ = fVar219;
        fVar218 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar92._20_4_);
        auVar111._20_4_ = fVar218;
        fVar167 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar92._24_4_);
        auVar111._24_4_ = fVar167;
        iVar1 = (uint)(byte)(uVar68 >> 7) * auVar92._28_4_;
        auVar111._28_4_ = iVar1;
        auVar105 = vblendmps_avx512vl(ZEXT1632(auVar85),auVar97);
        auVar112._0_4_ =
             (uint)(bVar67 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar23._0_4_;
        bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar14 * auVar105._4_4_ | (uint)!bVar14 * auVar23._4_4_;
        bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar14 * auVar105._8_4_ | (uint)!bVar14 * auVar23._8_4_;
        bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar14 * auVar105._12_4_ | (uint)!bVar14 * auVar23._12_4_;
        auVar112._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * auVar105._16_4_;
        auVar112._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * auVar105._20_4_;
        auVar112._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * auVar105._24_4_;
        auVar112._28_4_ = (uint)(byte)(uVar68 >> 7) * auVar105._28_4_;
        auVar105 = vblendmps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar89));
        auVar113._0_4_ =
             (float)((uint)(bVar67 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar81._0_4_
                    );
        bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar14 * auVar105._4_4_ | (uint)!bVar14 * auVar81._4_4_);
        bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar14 * auVar105._8_4_ | (uint)!bVar14 * auVar81._8_4_);
        bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar14 * auVar105._12_4_ | (uint)!bVar14 * auVar81._12_4_);
        fVar220 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar105._16_4_);
        auVar113._16_4_ = fVar220;
        fVar166 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar105._20_4_);
        auVar113._20_4_ = fVar166;
        fVar179 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar105._24_4_);
        auVar113._24_4_ = fVar179;
        auVar113._28_4_ = (uint)(byte)(uVar68 >> 7) * auVar105._28_4_;
        auVar105 = vblendmps_avx512vl(auVar107,ZEXT1632(auVar22));
        auVar114._0_4_ =
             (float)((uint)(bVar67 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar92._0_4_
                    );
        bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar14 * auVar105._4_4_ | (uint)!bVar14 * auVar92._4_4_);
        bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar14 * auVar105._8_4_ | (uint)!bVar14 * auVar92._8_4_);
        bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar14 * auVar105._12_4_ | (uint)!bVar14 * auVar92._12_4_);
        bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar14 * auVar105._16_4_ | (uint)!bVar14 * auVar92._16_4_);
        bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar14 * auVar105._20_4_ | (uint)!bVar14 * auVar92._20_4_);
        bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar14 * auVar105._24_4_ | (uint)!bVar14 * auVar92._24_4_);
        bVar14 = SUB81(uVar68 >> 7,0);
        auVar114._28_4_ = (uint)bVar14 * auVar105._28_4_ | (uint)!bVar14 * auVar92._28_4_;
        auVar115._0_4_ =
             (uint)(bVar67 & 1) * (int)auVar85._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar97._0_4_;
        bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar14 * (int)auVar85._4_4_ | (uint)!bVar14 * auVar97._4_4_;
        bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar14 * (int)auVar85._8_4_ | (uint)!bVar14 * auVar97._8_4_;
        bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar14 * (int)auVar85._12_4_ | (uint)!bVar14 * auVar97._12_4_;
        auVar115._16_4_ = (uint)!(bool)((byte)(uVar68 >> 4) & 1) * auVar97._16_4_;
        auVar115._20_4_ = (uint)!(bool)((byte)(uVar68 >> 5) & 1) * auVar97._20_4_;
        auVar115._24_4_ = (uint)!(bool)((byte)(uVar68 >> 6) & 1) * auVar97._24_4_;
        auVar115._28_4_ = (uint)!SUB81(uVar68 >> 7,0) * auVar97._28_4_;
        bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar68 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar116._0_4_ =
             (uint)(bVar67 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar22._0_4_;
        bVar15 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar15 * auVar107._4_4_ | (uint)!bVar15 * auVar22._4_4_;
        bVar15 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar15 * auVar107._8_4_ | (uint)!bVar15 * auVar22._8_4_;
        bVar15 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar15 * auVar107._12_4_ | (uint)!bVar15 * auVar22._12_4_;
        auVar116._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * auVar107._16_4_;
        auVar116._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * auVar107._20_4_;
        auVar116._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * auVar107._24_4_;
        iVar2 = (uint)(byte)(uVar68 >> 7) * auVar107._28_4_;
        auVar116._28_4_ = iVar2;
        auVar95 = vsubps_avx512vl(auVar115,auVar103);
        auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar88._12_4_ |
                                                 (uint)!bVar17 * auVar89._12_4_,
                                                 CONCAT48((uint)bVar16 * (int)auVar88._8_4_ |
                                                          (uint)!bVar16 * auVar89._8_4_,
                                                          CONCAT44((uint)bVar14 * (int)auVar88._4_4_
                                                                   | (uint)!bVar14 * auVar89._4_4_,
                                                                   (uint)(bVar67 & 1) *
                                                                   (int)auVar88._0_4_ |
                                                                   (uint)!(bool)(bVar67 & 1) *
                                                                   auVar89._0_4_)))),auVar94);
        auVar210 = ZEXT3264(auVar107);
        auVar105 = vsubps_avx(auVar116,auVar111);
        auVar104 = vsubps_avx(auVar103,auVar112);
        auVar215 = ZEXT3264(auVar104);
        auVar92 = vsubps_avx(auVar94,auVar113);
        auVar93 = vsubps_avx(auVar111,auVar114);
        auVar96._4_4_ = auVar105._4_4_ * fVar132;
        auVar96._0_4_ = auVar105._0_4_ * fVar78;
        auVar96._8_4_ = auVar105._8_4_ * fVar134;
        auVar96._12_4_ = auVar105._12_4_ * fVar137;
        auVar96._16_4_ = auVar105._16_4_ * 0.0;
        auVar96._20_4_ = auVar105._20_4_ * 0.0;
        auVar96._24_4_ = auVar105._24_4_ * 0.0;
        auVar96._28_4_ = iVar2;
        auVar80 = vfmsub231ps_fma(auVar96,auVar111,auVar95);
        auVar97._4_4_ = fVar133 * auVar95._4_4_;
        auVar97._0_4_ = fVar79 * auVar95._0_4_;
        auVar97._8_4_ = fVar135 * auVar95._8_4_;
        auVar97._12_4_ = fVar138 * auVar95._12_4_;
        auVar97._16_4_ = auVar95._16_4_ * 0.0;
        auVar97._20_4_ = auVar95._20_4_ * 0.0;
        auVar97._24_4_ = auVar95._24_4_ * 0.0;
        auVar97._28_4_ = auVar106._28_4_;
        auVar81 = vfmsub231ps_fma(auVar97,auVar103,auVar107);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar99,ZEXT1632(auVar80));
        auVar192._0_4_ = auVar107._0_4_ * auVar111._0_4_;
        auVar192._4_4_ = auVar107._4_4_ * auVar111._4_4_;
        auVar192._8_4_ = auVar107._8_4_ * auVar111._8_4_;
        auVar192._12_4_ = auVar107._12_4_ * auVar111._12_4_;
        auVar192._16_4_ = auVar107._16_4_ * fVar219;
        auVar192._20_4_ = auVar107._20_4_ * fVar218;
        auVar192._24_4_ = auVar107._24_4_ * fVar167;
        auVar192._28_4_ = 0;
        auVar80 = vfmsub231ps_fma(auVar192,auVar94,auVar105);
        auVar96 = vfmadd231ps_avx512vl(auVar106,auVar99,ZEXT1632(auVar80));
        auVar106 = vmulps_avx512vl(auVar93,auVar112);
        auVar106 = vfmsub231ps_avx512vl(auVar106,auVar104,auVar114);
        auVar98._4_4_ = auVar92._4_4_ * auVar114._4_4_;
        auVar98._0_4_ = auVar92._0_4_ * auVar114._0_4_;
        auVar98._8_4_ = auVar92._8_4_ * auVar114._8_4_;
        auVar98._12_4_ = auVar92._12_4_ * auVar114._12_4_;
        auVar98._16_4_ = auVar92._16_4_ * auVar114._16_4_;
        auVar98._20_4_ = auVar92._20_4_ * auVar114._20_4_;
        auVar98._24_4_ = auVar92._24_4_ * auVar114._24_4_;
        auVar98._28_4_ = auVar114._28_4_;
        auVar80 = vfmsub231ps_fma(auVar98,auVar113,auVar93);
        auVar193._0_4_ = auVar113._0_4_ * auVar104._0_4_;
        auVar193._4_4_ = auVar113._4_4_ * auVar104._4_4_;
        auVar193._8_4_ = auVar113._8_4_ * auVar104._8_4_;
        auVar193._12_4_ = auVar113._12_4_ * auVar104._12_4_;
        auVar193._16_4_ = fVar220 * auVar104._16_4_;
        auVar193._20_4_ = fVar166 * auVar104._20_4_;
        auVar193._24_4_ = fVar179 * auVar104._24_4_;
        auVar193._28_4_ = 0;
        auVar81 = vfmsub231ps_fma(auVar193,auVar92,auVar112);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar99,auVar106);
        auVar97 = vfmadd231ps_avx512vl(auVar106,auVar99,ZEXT1632(auVar80));
        auVar198 = ZEXT3264(auVar97);
        auVar106 = vmaxps_avx(auVar96,auVar97);
        uVar160 = vcmpps_avx512vl(auVar106,auVar99,2);
        bVar76 = bVar76 & (byte)uVar160;
        if (bVar76 != 0) {
          uVar141 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar231._4_4_ = uVar141;
          auVar231._0_4_ = uVar141;
          auVar231._8_4_ = uVar141;
          auVar231._12_4_ = uVar141;
          auVar231._16_4_ = uVar141;
          auVar231._20_4_ = uVar141;
          auVar231._24_4_ = uVar141;
          auVar231._28_4_ = uVar141;
          auVar234 = ZEXT3264(auVar231);
          auVar37._4_4_ = auVar93._4_4_ * auVar107._4_4_;
          auVar37._0_4_ = auVar93._0_4_ * auVar107._0_4_;
          auVar37._8_4_ = auVar93._8_4_ * auVar107._8_4_;
          auVar37._12_4_ = auVar93._12_4_ * auVar107._12_4_;
          auVar37._16_4_ = auVar93._16_4_ * auVar107._16_4_;
          auVar37._20_4_ = auVar93._20_4_ * auVar107._20_4_;
          auVar37._24_4_ = auVar93._24_4_ * auVar107._24_4_;
          auVar37._28_4_ = auVar106._28_4_;
          auVar22 = vfmsub231ps_fma(auVar37,auVar92,auVar105);
          auVar38._4_4_ = auVar105._4_4_ * auVar104._4_4_;
          auVar38._0_4_ = auVar105._0_4_ * auVar104._0_4_;
          auVar38._8_4_ = auVar105._8_4_ * auVar104._8_4_;
          auVar38._12_4_ = auVar105._12_4_ * auVar104._12_4_;
          auVar38._16_4_ = auVar105._16_4_ * auVar104._16_4_;
          auVar38._20_4_ = auVar105._20_4_ * auVar104._20_4_;
          auVar38._24_4_ = auVar105._24_4_ * auVar104._24_4_;
          auVar38._28_4_ = auVar105._28_4_;
          auVar89 = vfmsub231ps_fma(auVar38,auVar95,auVar93);
          auVar39._4_4_ = auVar92._4_4_ * auVar95._4_4_;
          auVar39._0_4_ = auVar92._0_4_ * auVar95._0_4_;
          auVar39._8_4_ = auVar92._8_4_ * auVar95._8_4_;
          auVar39._12_4_ = auVar92._12_4_ * auVar95._12_4_;
          auVar39._16_4_ = auVar92._16_4_ * auVar95._16_4_;
          auVar39._20_4_ = auVar92._20_4_ * auVar95._20_4_;
          auVar39._24_4_ = auVar92._24_4_ * auVar95._24_4_;
          auVar39._28_4_ = auVar92._28_4_;
          auVar23 = vfmsub231ps_fma(auVar39,auVar104,auVar107);
          auVar80 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar23));
          auVar81 = vfmadd231ps_fma(ZEXT1632(auVar80),ZEXT1632(auVar22),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar106 = vrcp14ps_avx512vl(ZEXT1632(auVar81));
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = 0x3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar32._16_4_ = 0x3f800000;
          auVar32._20_4_ = 0x3f800000;
          auVar32._24_4_ = 0x3f800000;
          auVar32._28_4_ = 0x3f800000;
          auVar107 = vfnmadd213ps_avx512vl(auVar106,ZEXT1632(auVar81),auVar32);
          auVar80 = vfmadd132ps_fma(auVar107,auVar106,auVar106);
          auVar210 = ZEXT1664(auVar80);
          auVar40._4_4_ = auVar23._4_4_ * auVar111._4_4_;
          auVar40._0_4_ = auVar23._0_4_ * auVar111._0_4_;
          auVar40._8_4_ = auVar23._8_4_ * auVar111._8_4_;
          auVar40._12_4_ = auVar23._12_4_ * auVar111._12_4_;
          auVar40._16_4_ = fVar219 * 0.0;
          auVar40._20_4_ = fVar218 * 0.0;
          auVar40._24_4_ = fVar167 * 0.0;
          auVar40._28_4_ = iVar1;
          auVar89 = vfmadd231ps_fma(auVar40,auVar94,ZEXT1632(auVar89));
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar103,ZEXT1632(auVar22));
          fVar167 = auVar80._0_4_;
          fVar218 = auVar80._4_4_;
          fVar219 = auVar80._8_4_;
          fVar220 = auVar80._12_4_;
          local_5e0._28_4_ = auVar106._28_4_;
          local_5e0._0_28_ =
               ZEXT1628(CONCAT412(auVar89._12_4_ * fVar220,
                                  CONCAT48(auVar89._8_4_ * fVar219,
                                           CONCAT44(auVar89._4_4_ * fVar218,auVar89._0_4_ * fVar167)
                                          )));
          auVar215 = ZEXT3264(local_5e0);
          auVar149._4_4_ = local_560;
          auVar149._0_4_ = local_560;
          auVar149._8_4_ = local_560;
          auVar149._12_4_ = local_560;
          auVar149._16_4_ = local_560;
          auVar149._20_4_ = local_560;
          auVar149._24_4_ = local_560;
          auVar149._28_4_ = local_560;
          uVar160 = vcmpps_avx512vl(local_5e0,auVar231,2);
          uVar28 = vcmpps_avx512vl(auVar149,local_5e0,2);
          bVar76 = (byte)uVar160 & (byte)uVar28 & bVar76;
          if (bVar76 != 0) {
            uVar77 = vcmpps_avx512vl(ZEXT1632(auVar81),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar77 = bVar76 & uVar77;
            if ((char)uVar77 != '\0') {
              fVar166 = auVar96._0_4_ * fVar167;
              fVar179 = auVar96._4_4_ * fVar218;
              auVar41._4_4_ = fVar179;
              auVar41._0_4_ = fVar166;
              fVar78 = auVar96._8_4_ * fVar219;
              auVar41._8_4_ = fVar78;
              fVar79 = auVar96._12_4_ * fVar220;
              auVar41._12_4_ = fVar79;
              fVar132 = auVar96._16_4_ * 0.0;
              auVar41._16_4_ = fVar132;
              fVar133 = auVar96._20_4_ * 0.0;
              auVar41._20_4_ = fVar133;
              fVar134 = auVar96._24_4_ * 0.0;
              auVar41._24_4_ = fVar134;
              auVar41._28_4_ = auVar96._28_4_;
              auVar150._8_4_ = 0x3f800000;
              auVar150._0_8_ = 0x3f8000003f800000;
              auVar150._12_4_ = 0x3f800000;
              auVar150._16_4_ = 0x3f800000;
              auVar150._20_4_ = 0x3f800000;
              auVar150._24_4_ = 0x3f800000;
              auVar150._28_4_ = 0x3f800000;
              auVar106 = vsubps_avx(auVar150,auVar41);
              local_400._0_4_ =
                   (float)((uint)(bVar67 & 1) * (int)fVar166 |
                          (uint)!(bool)(bVar67 & 1) * auVar106._0_4_);
              bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
              local_400._4_4_ =
                   (float)((uint)bVar14 * (int)fVar179 | (uint)!bVar14 * auVar106._4_4_);
              bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
              local_400._8_4_ = (float)((uint)bVar14 * (int)fVar78 | (uint)!bVar14 * auVar106._8_4_)
              ;
              bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
              local_400._12_4_ =
                   (float)((uint)bVar14 * (int)fVar79 | (uint)!bVar14 * auVar106._12_4_);
              bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
              local_400._16_4_ =
                   (float)((uint)bVar14 * (int)fVar132 | (uint)!bVar14 * auVar106._16_4_);
              bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
              local_400._20_4_ =
                   (float)((uint)bVar14 * (int)fVar133 | (uint)!bVar14 * auVar106._20_4_);
              bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
              local_400._24_4_ =
                   (float)((uint)bVar14 * (int)fVar134 | (uint)!bVar14 * auVar106._24_4_);
              bVar14 = SUB81(uVar68 >> 7,0);
              local_400._28_4_ =
                   (float)((uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * auVar106._28_4_);
              auVar106 = vsubps_avx(ZEXT1632(auVar27),auVar100);
              auVar80 = vfmadd213ps_fma(auVar106,local_400,auVar100);
              uVar141 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar100._4_4_ = uVar141;
              auVar100._0_4_ = uVar141;
              auVar100._8_4_ = uVar141;
              auVar100._12_4_ = uVar141;
              auVar100._16_4_ = uVar141;
              auVar100._20_4_ = uVar141;
              auVar100._24_4_ = uVar141;
              auVar100._28_4_ = uVar141;
              auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar80._12_4_ + auVar80._12_4_,
                                                            CONCAT48(auVar80._8_4_ + auVar80._8_4_,
                                                                     CONCAT44(auVar80._4_4_ +
                                                                              auVar80._4_4_,
                                                                              auVar80._0_4_ +
                                                                              auVar80._0_4_)))),
                                         auVar100);
              uVar29 = vcmpps_avx512vl(local_5e0,auVar106,6);
              uVar77 = uVar77 & uVar29;
              bVar76 = (byte)uVar77;
              if (bVar76 != 0) {
                auVar177._0_4_ = auVar97._0_4_ * fVar167;
                auVar177._4_4_ = auVar97._4_4_ * fVar218;
                auVar177._8_4_ = auVar97._8_4_ * fVar219;
                auVar177._12_4_ = auVar97._12_4_ * fVar220;
                auVar177._16_4_ = auVar97._16_4_ * 0.0;
                auVar177._20_4_ = auVar97._20_4_ * 0.0;
                auVar177._24_4_ = auVar97._24_4_ * 0.0;
                auVar177._28_4_ = 0;
                auVar187._8_4_ = 0x3f800000;
                auVar187._0_8_ = 0x3f8000003f800000;
                auVar187._12_4_ = 0x3f800000;
                auVar187._16_4_ = 0x3f800000;
                auVar187._20_4_ = 0x3f800000;
                auVar187._24_4_ = 0x3f800000;
                auVar187._28_4_ = 0x3f800000;
                auVar106 = vsubps_avx(auVar187,auVar177);
                auVar117._0_4_ =
                     (uint)(bVar67 & 1) * (int)auVar177._0_4_ |
                     (uint)!(bool)(bVar67 & 1) * auVar106._0_4_;
                bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
                auVar117._4_4_ = (uint)bVar14 * (int)auVar177._4_4_ | (uint)!bVar14 * auVar106._4_4_
                ;
                bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
                auVar117._8_4_ = (uint)bVar14 * (int)auVar177._8_4_ | (uint)!bVar14 * auVar106._8_4_
                ;
                bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
                auVar117._12_4_ =
                     (uint)bVar14 * (int)auVar177._12_4_ | (uint)!bVar14 * auVar106._12_4_;
                bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
                auVar117._16_4_ =
                     (uint)bVar14 * (int)auVar177._16_4_ | (uint)!bVar14 * auVar106._16_4_;
                bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
                auVar117._20_4_ =
                     (uint)bVar14 * (int)auVar177._20_4_ | (uint)!bVar14 * auVar106._20_4_;
                bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
                auVar117._24_4_ =
                     (uint)bVar14 * (int)auVar177._24_4_ | (uint)!bVar14 * auVar106._24_4_;
                auVar117._28_4_ = (uint)!SUB81(uVar68 >> 7,0) * auVar106._28_4_;
                auVar33._8_4_ = 0x40000000;
                auVar33._0_8_ = 0x4000000040000000;
                auVar33._12_4_ = 0x40000000;
                auVar33._16_4_ = 0x40000000;
                auVar33._20_4_ = 0x40000000;
                auVar33._24_4_ = 0x40000000;
                auVar33._28_4_ = 0x40000000;
                local_3e0 = vfmsub132ps_avx512vl(auVar117,auVar187,auVar33);
                local_3a0 = 0;
                local_390 = local_670;
                uStack_388 = uStack_668;
                local_380 = local_690;
                uStack_378 = uStack_688;
                local_370 = local_6a0;
                uStack_368 = uStack_698;
                local_360 = local_680;
                uStack_358 = uStack_678;
                if ((pGVar73->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar167 = 1.0 / auVar101._0_4_;
                  local_340[0] = fVar167 * (local_400._0_4_ + 0.0);
                  local_340[1] = fVar167 * (local_400._4_4_ + 1.0);
                  local_340[2] = fVar167 * (local_400._8_4_ + 2.0);
                  local_340[3] = fVar167 * (local_400._12_4_ + 3.0);
                  fStack_330 = fVar167 * (local_400._16_4_ + 4.0);
                  fStack_32c = fVar167 * (local_400._20_4_ + 5.0);
                  fStack_328 = fVar167 * (local_400._24_4_ + 6.0);
                  fStack_324 = local_400._28_4_ + 7.0;
                  local_320 = local_3e0;
                  local_300 = local_5e0;
                  auVar151._8_4_ = 0x7f800000;
                  auVar151._0_8_ = 0x7f8000007f800000;
                  auVar151._12_4_ = 0x7f800000;
                  auVar151._16_4_ = 0x7f800000;
                  auVar151._20_4_ = 0x7f800000;
                  auVar151._24_4_ = 0x7f800000;
                  auVar151._28_4_ = 0x7f800000;
                  auVar106 = vblendmps_avx512vl(auVar151,local_5e0);
                  auVar118._0_4_ =
                       (uint)(bVar76 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar76 & 1) * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar77 >> 1) & 1);
                  auVar118._4_4_ = (uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar77 >> 2) & 1);
                  auVar118._8_4_ = (uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
                  auVar118._12_4_ = (uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar77 >> 4) & 1);
                  auVar118._16_4_ = (uint)bVar14 * auVar106._16_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar77 >> 5) & 1);
                  auVar118._20_4_ = (uint)bVar14 * auVar106._20_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar77 >> 6) & 1);
                  auVar118._24_4_ = (uint)bVar14 * auVar106._24_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = SUB81(uVar77 >> 7,0);
                  auVar118._28_4_ = (uint)bVar14 * auVar106._28_4_ | (uint)!bVar14 * 0x7f800000;
                  auVar106 = vshufps_avx(auVar118,auVar118,0xb1);
                  auVar106 = vminps_avx(auVar118,auVar106);
                  auVar107 = vshufpd_avx(auVar106,auVar106,5);
                  auVar106 = vminps_avx(auVar106,auVar107);
                  auVar107 = vpermpd_avx2(auVar106,0x4e);
                  auVar106 = vminps_avx(auVar106,auVar107);
                  uVar160 = vcmpps_avx512vl(auVar118,auVar106,0);
                  uVar69 = (uint)uVar77;
                  if (((byte)uVar160 & bVar76) != 0) {
                    uVar69 = (uint)((byte)uVar160 & bVar76);
                  }
                  uVar70 = 0;
                  for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
                    uVar70 = uVar70 + 1;
                  }
                  uVar68 = (ulong)uVar70;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar73->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_520 = vpbroadcastd_avx512vl();
                    local_540 = vpbroadcastd_avx512vl();
                    local_3c0 = local_5e0;
                    local_39c = iVar8;
                    do {
                      local_1c0 = local_340[uVar68];
                      local_1a0 = *(undefined4 *)(local_320 + uVar68 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar68 * 4)
                      ;
                      local_660.context = context->user;
                      fVar218 = 1.0 - local_1c0;
                      fVar167 = fVar218 * fVar218 * -3.0;
                      auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * fVar218)),
                                                ZEXT416((uint)(local_1c0 * fVar218)),
                                                ZEXT416(0xc0000000));
                      auVar81 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar218)),
                                                ZEXT416((uint)(local_1c0 * local_1c0)),
                                                ZEXT416(0x40000000));
                      fVar218 = auVar80._0_4_ * 3.0;
                      fVar219 = auVar81._0_4_ * 3.0;
                      fVar220 = local_1c0 * local_1c0 * 3.0;
                      auVar206._0_4_ = fVar220 * fVar157;
                      auVar206._4_4_ = fVar220 * fVar158;
                      auVar206._8_4_ = fVar220 * fVar159;
                      auVar206._12_4_ = fVar220 * fVar65;
                      auVar147._4_4_ = fVar219;
                      auVar147._0_4_ = fVar219;
                      auVar147._8_4_ = fVar219;
                      auVar147._12_4_ = fVar219;
                      auVar80 = vfmadd132ps_fma(auVar147,auVar206,auVar87);
                      auVar186._4_4_ = fVar218;
                      auVar186._0_4_ = fVar218;
                      auVar186._8_4_ = fVar218;
                      auVar186._12_4_ = fVar218;
                      auVar80 = vfmadd132ps_fma(auVar186,auVar80,auVar86);
                      auVar148._4_4_ = fVar167;
                      auVar148._0_4_ = fVar167;
                      auVar148._8_4_ = fVar167;
                      auVar148._12_4_ = fVar167;
                      auVar80 = vfmadd132ps_fma(auVar148,auVar80,auVar21);
                      local_220 = auVar80._0_4_;
                      auVar197._8_4_ = 1;
                      auVar197._0_8_ = 0x100000001;
                      auVar197._12_4_ = 1;
                      auVar197._16_4_ = 1;
                      auVar197._20_4_ = 1;
                      auVar197._24_4_ = 1;
                      auVar197._28_4_ = 1;
                      local_200 = vpermps_avx2(auVar197,ZEXT1632(auVar80));
                      auVar198 = ZEXT3264(local_200);
                      auVar207._8_4_ = 2;
                      auVar207._0_8_ = 0x200000002;
                      auVar207._12_4_ = 2;
                      auVar209._16_4_ = 2;
                      auVar209._0_16_ = auVar207;
                      auVar209._20_4_ = 2;
                      auVar209._24_4_ = 2;
                      auVar209._28_4_ = 2;
                      auVar210 = ZEXT3264(auVar209);
                      local_1e0 = vpermps_avx2(auVar209,ZEXT1632(auVar80));
                      iStack_21c = local_220;
                      iStack_218 = local_220;
                      iStack_214 = local_220;
                      iStack_210 = local_220;
                      iStack_20c = local_220;
                      iStack_208 = local_220;
                      iStack_204 = local_220;
                      fStack_1bc = local_1c0;
                      fStack_1b8 = local_1c0;
                      fStack_1b4 = local_1c0;
                      fStack_1b0 = local_1c0;
                      fStack_1ac = local_1c0;
                      fStack_1a8 = local_1c0;
                      fStack_1a4 = local_1c0;
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = local_540._0_8_;
                      uStack_178 = local_540._8_8_;
                      uStack_170 = local_540._16_8_;
                      uStack_168 = local_540._24_8_;
                      local_160 = local_520;
                      auVar106 = vpcmpeqd_avx2(local_520,local_520);
                      local_628[1] = auVar106;
                      *local_628 = auVar106;
                      local_140 = (local_660.context)->instID[0];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      local_120 = (local_660.context)->instPrimID[0];
                      uStack_11c = local_120;
                      uStack_118 = local_120;
                      uStack_114 = local_120;
                      uStack_110 = local_120;
                      uStack_10c = local_120;
                      uStack_108 = local_120;
                      uStack_104 = local_120;
                      local_620 = local_2c0;
                      local_660.valid = (int *)local_620;
                      local_660.geometryUserPtr = pGVar73->userPtr;
                      local_660.hit = (RTCHitN *)&local_220;
                      local_660.N = 8;
                      local_5a0 = auVar234._0_32_;
                      local_660.ray = (RTCRayN *)ray;
                      if (pGVar73->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar198 = ZEXT1664(local_200._0_16_);
                        auVar210 = ZEXT1664(auVar207);
                        (*pGVar73->intersectionFilterN)(&local_660);
                        auVar215 = ZEXT3264(local_5e0);
                        auVar234 = ZEXT3264(local_5a0);
                        auVar80 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
                        auVar238 = ZEXT1664(auVar80);
                        auVar237 = ZEXT464(0xbf800000);
                        auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar236 = ZEXT1664(auVar80);
                      }
                      if (local_620 == (undefined1  [32])0x0) {
LAB_01bf1c12:
                        *(int *)(ray + k * 4 + 0x100) = auVar234._0_4_;
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar73->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar198 = ZEXT1664(auVar198._0_16_);
                          auVar210 = ZEXT1664(auVar210._0_16_);
                          (*p_Var13)(&local_660);
                          auVar215 = ZEXT3264(local_5e0);
                          auVar234 = ZEXT3264(local_5a0);
                          auVar80 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
                          auVar238 = ZEXT1664(auVar80);
                          auVar237 = ZEXT464(0xbf800000);
                          auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar236 = ZEXT1664(auVar80);
                        }
                        if (local_620 == (undefined1  [32])0x0) goto LAB_01bf1c12;
                        uVar29 = vptestmd_avx512vl(local_620,local_620);
                        iVar1 = *(int *)(local_660.hit + 4);
                        iVar2 = *(int *)(local_660.hit + 8);
                        iVar59 = *(int *)(local_660.hit + 0xc);
                        iVar60 = *(int *)(local_660.hit + 0x10);
                        iVar61 = *(int *)(local_660.hit + 0x14);
                        iVar62 = *(int *)(local_660.hit + 0x18);
                        iVar63 = *(int *)(local_660.hit + 0x1c);
                        bVar76 = (byte)uVar29;
                        bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                        bVar20 = SUB81(uVar29 >> 7,0);
                        *(uint *)(local_660.ray + 0x180) =
                             (uint)(bVar76 & 1) * *(int *)local_660.hit |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_660.ray + 0x180);
                        *(uint *)(local_660.ray + 0x184) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_660.ray + 0x184);
                        *(uint *)(local_660.ray + 0x188) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_660.ray + 0x188);
                        *(uint *)(local_660.ray + 0x18c) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_660.ray + 0x18c)
                        ;
                        *(uint *)(local_660.ray + 400) =
                             (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_660.ray + 400);
                        *(uint *)(local_660.ray + 0x194) =
                             (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_660.ray + 0x194)
                        ;
                        *(uint *)(local_660.ray + 0x198) =
                             (uint)bVar19 * iVar62 | (uint)!bVar19 * *(int *)(local_660.ray + 0x198)
                        ;
                        *(uint *)(local_660.ray + 0x19c) =
                             (uint)bVar20 * iVar63 | (uint)!bVar20 * *(int *)(local_660.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_660.hit + 0x24);
                        iVar2 = *(int *)(local_660.hit + 0x28);
                        iVar59 = *(int *)(local_660.hit + 0x2c);
                        iVar60 = *(int *)(local_660.hit + 0x30);
                        iVar61 = *(int *)(local_660.hit + 0x34);
                        iVar62 = *(int *)(local_660.hit + 0x38);
                        iVar63 = *(int *)(local_660.hit + 0x3c);
                        bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                        bVar20 = SUB81(uVar29 >> 7,0);
                        *(uint *)(local_660.ray + 0x1a0) =
                             (uint)(bVar76 & 1) * *(int *)(local_660.hit + 0x20) |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_660.ray + 0x1a0);
                        *(uint *)(local_660.ray + 0x1a4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_660.ray + 0x1a4);
                        *(uint *)(local_660.ray + 0x1a8) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_660.ray + 0x1a8);
                        *(uint *)(local_660.ray + 0x1ac) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_660.ray + 0x1ac)
                        ;
                        *(uint *)(local_660.ray + 0x1b0) =
                             (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_660.ray + 0x1b0)
                        ;
                        *(uint *)(local_660.ray + 0x1b4) =
                             (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_660.ray + 0x1b4)
                        ;
                        *(uint *)(local_660.ray + 0x1b8) =
                             (uint)bVar19 * iVar62 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1b8)
                        ;
                        *(uint *)(local_660.ray + 0x1bc) =
                             (uint)bVar20 * iVar63 | (uint)!bVar20 * *(int *)(local_660.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_660.hit + 0x44);
                        iVar2 = *(int *)(local_660.hit + 0x48);
                        iVar59 = *(int *)(local_660.hit + 0x4c);
                        iVar60 = *(int *)(local_660.hit + 0x50);
                        iVar61 = *(int *)(local_660.hit + 0x54);
                        iVar62 = *(int *)(local_660.hit + 0x58);
                        iVar63 = *(int *)(local_660.hit + 0x5c);
                        bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                        bVar20 = SUB81(uVar29 >> 7,0);
                        *(uint *)(local_660.ray + 0x1c0) =
                             (uint)(bVar76 & 1) * *(int *)(local_660.hit + 0x40) |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_660.ray + 0x1c0);
                        *(uint *)(local_660.ray + 0x1c4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_660.ray + 0x1c4);
                        *(uint *)(local_660.ray + 0x1c8) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_660.ray + 0x1c8);
                        *(uint *)(local_660.ray + 0x1cc) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_660.ray + 0x1cc)
                        ;
                        *(uint *)(local_660.ray + 0x1d0) =
                             (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_660.ray + 0x1d0)
                        ;
                        *(uint *)(local_660.ray + 0x1d4) =
                             (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_660.ray + 0x1d4)
                        ;
                        *(uint *)(local_660.ray + 0x1d8) =
                             (uint)bVar19 * iVar62 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1d8)
                        ;
                        *(uint *)(local_660.ray + 0x1dc) =
                             (uint)bVar20 * iVar63 | (uint)!bVar20 * *(int *)(local_660.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_660.hit + 100);
                        iVar2 = *(int *)(local_660.hit + 0x68);
                        iVar59 = *(int *)(local_660.hit + 0x6c);
                        iVar60 = *(int *)(local_660.hit + 0x70);
                        iVar61 = *(int *)(local_660.hit + 0x74);
                        iVar62 = *(int *)(local_660.hit + 0x78);
                        iVar63 = *(int *)(local_660.hit + 0x7c);
                        bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                        bVar20 = SUB81(uVar29 >> 7,0);
                        *(uint *)(local_660.ray + 0x1e0) =
                             (uint)(bVar76 & 1) * *(int *)(local_660.hit + 0x60) |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_660.ray + 0x1e0);
                        *(uint *)(local_660.ray + 0x1e4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_660.ray + 0x1e4);
                        *(uint *)(local_660.ray + 0x1e8) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_660.ray + 0x1e8);
                        *(uint *)(local_660.ray + 0x1ec) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_660.ray + 0x1ec)
                        ;
                        *(uint *)(local_660.ray + 0x1f0) =
                             (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_660.ray + 0x1f0)
                        ;
                        *(uint *)(local_660.ray + 500) =
                             (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_660.ray + 500);
                        *(uint *)(local_660.ray + 0x1f8) =
                             (uint)bVar19 * iVar62 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1f8)
                        ;
                        *(uint *)(local_660.ray + 0x1fc) =
                             (uint)bVar20 * iVar63 | (uint)!bVar20 * *(int *)(local_660.ray + 0x1fc)
                        ;
                        iVar1 = *(int *)(local_660.hit + 0x84);
                        iVar2 = *(int *)(local_660.hit + 0x88);
                        iVar59 = *(int *)(local_660.hit + 0x8c);
                        iVar60 = *(int *)(local_660.hit + 0x90);
                        iVar61 = *(int *)(local_660.hit + 0x94);
                        iVar62 = *(int *)(local_660.hit + 0x98);
                        iVar63 = *(int *)(local_660.hit + 0x9c);
                        bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                        bVar20 = SUB81(uVar29 >> 7,0);
                        *(uint *)(local_660.ray + 0x200) =
                             (uint)(bVar76 & 1) * *(int *)(local_660.hit + 0x80) |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_660.ray + 0x200);
                        *(uint *)(local_660.ray + 0x204) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_660.ray + 0x204);
                        *(uint *)(local_660.ray + 0x208) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_660.ray + 0x208);
                        *(uint *)(local_660.ray + 0x20c) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_660.ray + 0x20c)
                        ;
                        *(uint *)(local_660.ray + 0x210) =
                             (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_660.ray + 0x210)
                        ;
                        *(uint *)(local_660.ray + 0x214) =
                             (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_660.ray + 0x214)
                        ;
                        *(uint *)(local_660.ray + 0x218) =
                             (uint)bVar19 * iVar62 | (uint)!bVar19 * *(int *)(local_660.ray + 0x218)
                        ;
                        *(uint *)(local_660.ray + 0x21c) =
                             (uint)bVar20 * iVar63 | (uint)!bVar20 * *(int *)(local_660.ray + 0x21c)
                        ;
                        auVar106 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xa0));
                        *(undefined1 (*) [32])(local_660.ray + 0x220) = auVar106;
                        auVar106 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xc0));
                        *(undefined1 (*) [32])(local_660.ray + 0x240) = auVar106;
                        auVar106 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xe0));
                        *(undefined1 (*) [32])(local_660.ray + 0x260) = auVar106;
                        auVar106 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_660.ray + 0x280) = auVar106;
                        auVar234 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                      }
                      bVar76 = ~(byte)(1 << ((uint)uVar68 & 0x1f)) & (byte)uVar77;
                      uVar141 = auVar234._0_4_;
                      auVar155._4_4_ = uVar141;
                      auVar155._0_4_ = uVar141;
                      auVar155._8_4_ = uVar141;
                      auVar155._12_4_ = uVar141;
                      auVar155._16_4_ = uVar141;
                      auVar155._20_4_ = uVar141;
                      auVar155._24_4_ = uVar141;
                      auVar155._28_4_ = uVar141;
                      uVar160 = vcmpps_avx512vl(auVar215._0_32_,auVar155,2);
                      if ((bVar76 & (byte)uVar160) == 0) goto LAB_01bf0b7b;
                      bVar76 = bVar76 & (byte)uVar160;
                      uVar77 = (ulong)bVar76;
                      auVar156._8_4_ = 0x7f800000;
                      auVar156._0_8_ = 0x7f8000007f800000;
                      auVar156._12_4_ = 0x7f800000;
                      auVar156._16_4_ = 0x7f800000;
                      auVar156._20_4_ = 0x7f800000;
                      auVar156._24_4_ = 0x7f800000;
                      auVar156._28_4_ = 0x7f800000;
                      auVar106 = vblendmps_avx512vl(auVar156,auVar215._0_32_);
                      auVar131._0_4_ =
                           (uint)(bVar76 & 1) * auVar106._0_4_ |
                           (uint)!(bool)(bVar76 & 1) * 0x7f800000;
                      bVar14 = (bool)(bVar76 >> 1 & 1);
                      auVar131._4_4_ = (uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar76 >> 2 & 1);
                      auVar131._8_4_ = (uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar76 >> 3 & 1);
                      auVar131._12_4_ = (uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar76 >> 4 & 1);
                      auVar131._16_4_ = (uint)bVar14 * auVar106._16_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar76 >> 5 & 1);
                      auVar131._20_4_ = (uint)bVar14 * auVar106._20_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar76 >> 6 & 1);
                      auVar131._24_4_ = (uint)bVar14 * auVar106._24_4_ | (uint)!bVar14 * 0x7f800000;
                      auVar131._28_4_ =
                           (uint)(bVar76 >> 7) * auVar106._28_4_ |
                           (uint)!(bool)(bVar76 >> 7) * 0x7f800000;
                      auVar106 = vshufps_avx(auVar131,auVar131,0xb1);
                      auVar106 = vminps_avx(auVar131,auVar106);
                      auVar107 = vshufpd_avx(auVar106,auVar106,5);
                      auVar106 = vminps_avx(auVar106,auVar107);
                      auVar107 = vpermpd_avx2(auVar106,0x4e);
                      auVar106 = vminps_avx(auVar106,auVar107);
                      uVar160 = vcmpps_avx512vl(auVar131,auVar106,0);
                      bVar67 = (byte)uVar160 & bVar76;
                      if (bVar67 != 0) {
                        bVar76 = bVar67;
                      }
                      uVar69 = 0;
                      for (uVar70 = (uint)bVar76; (uVar70 & 1) == 0;
                          uVar70 = uVar70 >> 1 | 0x80000000) {
                        uVar69 = uVar69 + 1;
                      }
                      uVar68 = (ulong)uVar69;
                    } while( true );
                  }
                  fVar167 = local_340[uVar68];
                  uVar141 = *(undefined4 *)(local_320 + uVar68 * 4);
                  fVar219 = 1.0 - fVar167;
                  fVar218 = fVar219 * fVar219 * -3.0;
                  auVar198 = ZEXT464((uint)fVar218);
                  auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * fVar219)),
                                            ZEXT416((uint)(fVar167 * fVar219)),ZEXT416(0xc0000000));
                  auVar81 = vfmsub132ss_fma(ZEXT416((uint)(fVar167 * fVar219)),
                                            ZEXT416((uint)(fVar167 * fVar167)),ZEXT416(0x40000000));
                  fVar219 = auVar80._0_4_ * 3.0;
                  fVar220 = auVar81._0_4_ * 3.0;
                  fVar166 = fVar167 * fVar167 * 3.0;
                  auVar202._0_4_ = fVar166 * fVar157;
                  auVar202._4_4_ = fVar166 * fVar158;
                  auVar202._8_4_ = fVar166 * fVar159;
                  auVar202._12_4_ = fVar166 * fVar65;
                  auVar210 = ZEXT1664(auVar202);
                  auVar173._4_4_ = fVar220;
                  auVar173._0_4_ = fVar220;
                  auVar173._8_4_ = fVar220;
                  auVar173._12_4_ = fVar220;
                  auVar80 = vfmadd132ps_fma(auVar173,auVar202,auVar87);
                  auVar183._4_4_ = fVar219;
                  auVar183._0_4_ = fVar219;
                  auVar183._8_4_ = fVar219;
                  auVar183._12_4_ = fVar219;
                  auVar80 = vfmadd132ps_fma(auVar183,auVar80,auVar86);
                  auVar174._4_4_ = fVar218;
                  auVar174._0_4_ = fVar218;
                  auVar174._8_4_ = fVar218;
                  auVar174._12_4_ = fVar218;
                  auVar80 = vfmadd132ps_fma(auVar174,auVar80,auVar21);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar68 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar80._0_4_;
                  uVar9 = vextractps_avx(auVar80,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                  uVar9 = vextractps_avx(auVar80,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar9;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar167;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar141;
                  *(uint *)(ray + k * 4 + 0x220) = uVar7;
                  *(uint *)(ray + k * 4 + 0x240) = uVar74;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01bf0b7b:
      if (8 < iVar8) {
        local_5a0 = vpbroadcastd_avx512vl();
        local_520._4_4_ = local_5c0._0_4_;
        local_520._0_4_ = local_5c0._0_4_;
        local_520._8_4_ = local_5c0._0_4_;
        local_520._12_4_ = local_5c0._0_4_;
        local_520._16_4_ = local_5c0._0_4_;
        local_520._20_4_ = local_5c0._0_4_;
        local_520._24_4_ = local_5c0._0_4_;
        local_520._28_4_ = local_5c0._0_4_;
        uStack_55c = local_560;
        uStack_558 = local_560;
        uStack_554 = local_560;
        uStack_550 = local_560;
        uStack_54c = local_560;
        uStack_548 = local_560;
        uStack_544 = local_560;
        local_100 = 1.0 / (float)local_580._0_4_;
        fStack_fc = local_100;
        fStack_f8 = local_100;
        fStack_f4 = local_100;
        fStack_f0 = local_100;
        fStack_ec = local_100;
        fStack_e8 = local_100;
        fStack_e4 = local_100;
        local_580 = vpbroadcastd_avx512vl();
        local_540 = vpbroadcastd_avx512vl();
        lVar72 = 8;
LAB_01bf0c31:
        auVar106 = vpbroadcastd_avx512vl();
        auVar106 = vpor_avx2(auVar106,_DAT_01fe9900);
        uVar28 = vpcmpd_avx512vl(auVar106,local_5a0,1);
        auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 * 4 + lVar30);
        auVar107 = *(undefined1 (*) [32])(lVar30 + 0x21aa768 + lVar72 * 4);
        auVar105 = *(undefined1 (*) [32])(lVar30 + 0x21aabec + lVar72 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar30 + 0x21ab070 + lVar72 * 4);
        auVar234._0_4_ = auVar104._0_4_ * (float)local_4e0._0_4_;
        auVar234._4_4_ = auVar104._4_4_ * (float)local_4e0._4_4_;
        auVar234._8_4_ = auVar104._8_4_ * fStack_4d8;
        auVar234._12_4_ = auVar104._12_4_ * fStack_4d4;
        auVar234._16_4_ = auVar104._16_4_ * fStack_4d0;
        auVar234._20_4_ = auVar104._20_4_ * fStack_4cc;
        auVar234._28_36_ = auVar210._28_36_;
        auVar234._24_4_ = auVar104._24_4_ * fStack_4c8;
        auVar210._0_4_ = auVar104._0_4_ * (float)local_500._0_4_;
        auVar210._4_4_ = auVar104._4_4_ * (float)local_500._4_4_;
        auVar210._8_4_ = auVar104._8_4_ * fStack_4f8;
        auVar210._12_4_ = auVar104._12_4_ * fStack_4f4;
        auVar210._16_4_ = auVar104._16_4_ * fStack_4f0;
        auVar210._20_4_ = auVar104._20_4_ * fStack_4ec;
        auVar210._28_36_ = auVar198._28_36_;
        auVar210._24_4_ = auVar104._24_4_ * fStack_4e8;
        auVar92 = vmulps_avx512vl(local_e0,auVar104);
        auVar93 = vfmadd231ps_avx512vl(auVar234._0_32_,auVar105,local_4a0);
        auVar103 = vfmadd231ps_avx512vl(auVar210._0_32_,auVar105,local_4c0);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar105,local_c0);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar107,local_460);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,local_480);
        auVar94 = vfmadd231ps_avx512vl(auVar92,auVar107,local_a0);
        auVar80 = vfmadd231ps_fma(auVar93,auVar106,local_420);
        auVar210 = ZEXT1664(auVar80);
        auVar81 = vfmadd231ps_fma(auVar103,auVar106,local_440);
        auVar198 = ZEXT1664(auVar81);
        auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 * 4 + lVar30);
        auVar93 = *(undefined1 (*) [32])(lVar30 + 0x21acb88 + lVar72 * 4);
        auVar97 = vfmadd231ps_avx512vl(auVar94,auVar106,local_80);
        auVar103 = *(undefined1 (*) [32])(lVar30 + 0x21ad00c + lVar72 * 4);
        auVar94 = *(undefined1 (*) [32])(lVar30 + 0x21ad490 + lVar72 * 4);
        auVar216._0_4_ = auVar94._0_4_ * (float)local_4e0._0_4_;
        auVar216._4_4_ = auVar94._4_4_ * (float)local_4e0._4_4_;
        auVar216._8_4_ = auVar94._8_4_ * fStack_4d8;
        auVar216._12_4_ = auVar94._12_4_ * fStack_4d4;
        auVar216._16_4_ = auVar94._16_4_ * fStack_4d0;
        auVar216._20_4_ = auVar94._20_4_ * fStack_4cc;
        auVar216._28_36_ = auVar215._28_36_;
        auVar216._24_4_ = auVar94._24_4_ * fStack_4c8;
        auVar42._4_4_ = auVar94._4_4_ * (float)local_500._4_4_;
        auVar42._0_4_ = auVar94._0_4_ * (float)local_500._0_4_;
        auVar42._8_4_ = auVar94._8_4_ * fStack_4f8;
        auVar42._12_4_ = auVar94._12_4_ * fStack_4f4;
        auVar42._16_4_ = auVar94._16_4_ * fStack_4f0;
        auVar42._20_4_ = auVar94._20_4_ * fStack_4ec;
        auVar42._24_4_ = auVar94._24_4_ * fStack_4e8;
        auVar42._28_4_ = uStack_4e4;
        auVar95 = vmulps_avx512vl(local_e0,auVar94);
        auVar96 = vfmadd231ps_avx512vl(auVar216._0_32_,auVar103,local_4a0);
        auVar98 = vfmadd231ps_avx512vl(auVar42,auVar103,local_4c0);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar103,local_c0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_460);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_480);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,local_a0);
        auVar89 = vfmadd231ps_fma(auVar96,auVar92,local_420);
        auVar215 = ZEXT1664(auVar89);
        auVar22 = vfmadd231ps_fma(auVar98,auVar92,local_440);
        auVar98 = vfmadd231ps_avx512vl(auVar95,auVar92,local_80);
        auVar99 = vmaxps_avx512vl(auVar97,auVar98);
        auVar95 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar80));
        auVar96 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar81));
        auVar100 = vmulps_avx512vl(ZEXT1632(auVar81),auVar95);
        auVar101 = vmulps_avx512vl(ZEXT1632(auVar80),auVar96);
        auVar100 = vsubps_avx512vl(auVar100,auVar101);
        auVar101 = vmulps_avx512vl(auVar96,auVar96);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar95,auVar95);
        auVar99 = vmulps_avx512vl(auVar99,auVar99);
        auVar99 = vmulps_avx512vl(auVar99,auVar101);
        auVar100 = vmulps_avx512vl(auVar100,auVar100);
        uVar160 = vcmpps_avx512vl(auVar100,auVar99,2);
        bVar76 = (byte)uVar28 & (byte)uVar160;
        if (bVar76 != 0) {
          auVar94 = vmulps_avx512vl(local_2a0,auVar94);
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_280,auVar94);
          auVar93 = vfmadd213ps_avx512vl(auVar93,local_260,auVar103);
          auVar92 = vfmadd213ps_avx512vl(auVar92,local_240,auVar93);
          auVar104 = vmulps_avx512vl(local_2a0,auVar104);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_280,auVar104);
          auVar107 = vfmadd213ps_avx512vl(auVar107,local_260,auVar105);
          auVar93 = vfmadd213ps_avx512vl(auVar106,local_240,auVar107);
          auVar106 = *(undefined1 (*) [32])(lVar30 + 0x21ab4f4 + lVar72 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar30 + 0x21ab978 + lVar72 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar30 + 0x21abdfc + lVar72 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar30 + 0x21ac280 + lVar72 * 4);
          auVar103 = vmulps_avx512vl(_local_4e0,auVar104);
          auVar94 = vmulps_avx512vl(_local_500,auVar104);
          auVar104 = vmulps_avx512vl(local_2a0,auVar104);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar105,local_4a0);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar105,local_4c0);
          auVar105 = vfmadd231ps_avx512vl(auVar104,local_280,auVar105);
          auVar104 = vfmadd231ps_avx512vl(auVar103,auVar107,local_460);
          auVar103 = vfmadd231ps_avx512vl(auVar94,auVar107,local_480);
          auVar107 = vfmadd231ps_avx512vl(auVar105,local_260,auVar107);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar106,local_420);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar106,local_440);
          auVar94 = vfmadd231ps_avx512vl(auVar107,local_240,auVar106);
          auVar106 = *(undefined1 (*) [32])(lVar30 + 0x21ad914 + lVar72 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar30 + 0x21ae21c + lVar72 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar30 + 0x21ae6a0 + lVar72 * 4);
          auVar99 = vmulps_avx512vl(_local_4e0,auVar105);
          auVar100 = vmulps_avx512vl(_local_500,auVar105);
          auVar105 = vmulps_avx512vl(local_2a0,auVar105);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,local_4a0);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar107,local_4c0);
          auVar105 = vfmadd231ps_avx512vl(auVar105,local_280,auVar107);
          auVar107 = *(undefined1 (*) [32])(lVar30 + 0x21add98 + lVar72 * 4);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,local_460);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar107,local_480);
          auVar107 = vfmadd231ps_avx512vl(auVar105,local_260,auVar107);
          auVar105 = vfmadd231ps_avx512vl(auVar99,auVar106,local_420);
          auVar99 = vfmadd231ps_avx512vl(auVar100,auVar106,local_440);
          auVar107 = vfmadd231ps_avx512vl(auVar107,local_240,auVar106);
          auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar104,auVar100);
          vandps_avx512vl(auVar103,auVar100);
          auVar106 = vmaxps_avx(auVar100,auVar100);
          vandps_avx512vl(auVar94,auVar100);
          auVar106 = vmaxps_avx(auVar106,auVar100);
          uVar68 = vcmpps_avx512vl(auVar106,local_520,1);
          bVar14 = (bool)((byte)uVar68 & 1);
          auVar119._0_4_ = (float)((uint)bVar14 * auVar95._0_4_ | (uint)!bVar14 * auVar104._0_4_);
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * auVar104._4_4_);
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * auVar104._8_4_);
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * auVar104._12_4_)
          ;
          bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar119._16_4_ = (float)((uint)bVar14 * auVar95._16_4_ | (uint)!bVar14 * auVar104._16_4_)
          ;
          bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar119._20_4_ = (float)((uint)bVar14 * auVar95._20_4_ | (uint)!bVar14 * auVar104._20_4_)
          ;
          bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar119._24_4_ = (float)((uint)bVar14 * auVar95._24_4_ | (uint)!bVar14 * auVar104._24_4_)
          ;
          bVar14 = SUB81(uVar68 >> 7,0);
          auVar119._28_4_ = (uint)bVar14 * auVar95._28_4_ | (uint)!bVar14 * auVar104._28_4_;
          bVar14 = (bool)((byte)uVar68 & 1);
          auVar120._0_4_ = (float)((uint)bVar14 * auVar96._0_4_ | (uint)!bVar14 * auVar103._0_4_);
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar103._4_4_);
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar103._8_4_);
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar103._12_4_)
          ;
          bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar120._16_4_ = (float)((uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * auVar103._16_4_)
          ;
          bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar120._20_4_ = (float)((uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * auVar103._20_4_)
          ;
          bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar120._24_4_ = (float)((uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * auVar103._24_4_)
          ;
          bVar14 = SUB81(uVar68 >> 7,0);
          auVar120._28_4_ = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * auVar103._28_4_;
          vandps_avx512vl(auVar105,auVar100);
          vandps_avx512vl(auVar99,auVar100);
          auVar106 = vmaxps_avx(auVar120,auVar120);
          vandps_avx512vl(auVar107,auVar100);
          auVar106 = vmaxps_avx(auVar106,auVar120);
          uVar68 = vcmpps_avx512vl(auVar106,local_520,1);
          bVar14 = (bool)((byte)uVar68 & 1);
          auVar121._0_4_ = (uint)bVar14 * auVar95._0_4_ | (uint)!bVar14 * auVar105._0_4_;
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar121._4_4_ = (uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * auVar105._4_4_;
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar121._8_4_ = (uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * auVar105._8_4_;
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar121._12_4_ = (uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * auVar105._12_4_;
          bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar121._16_4_ = (uint)bVar14 * auVar95._16_4_ | (uint)!bVar14 * auVar105._16_4_;
          bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar121._20_4_ = (uint)bVar14 * auVar95._20_4_ | (uint)!bVar14 * auVar105._20_4_;
          bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar121._24_4_ = (uint)bVar14 * auVar95._24_4_ | (uint)!bVar14 * auVar105._24_4_;
          bVar14 = SUB81(uVar68 >> 7,0);
          auVar121._28_4_ = (uint)bVar14 * auVar95._28_4_ | (uint)!bVar14 * auVar105._28_4_;
          bVar14 = (bool)((byte)uVar68 & 1);
          auVar122._0_4_ = (float)((uint)bVar14 * auVar96._0_4_ | (uint)!bVar14 * auVar99._0_4_);
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar99._4_4_);
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar99._8_4_);
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar99._12_4_);
          bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar122._16_4_ = (float)((uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * auVar99._16_4_);
          bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar122._20_4_ = (float)((uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * auVar99._20_4_);
          bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar122._24_4_ = (float)((uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * auVar99._24_4_);
          bVar14 = SUB81(uVar68 >> 7,0);
          auVar122._28_4_ = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * auVar99._28_4_;
          auVar223._8_4_ = 0x80000000;
          auVar223._0_8_ = 0x8000000080000000;
          auVar223._12_4_ = 0x80000000;
          auVar223._16_4_ = 0x80000000;
          auVar223._20_4_ = 0x80000000;
          auVar223._24_4_ = 0x80000000;
          auVar223._28_4_ = 0x80000000;
          auVar106 = vxorps_avx512vl(auVar121,auVar223);
          auVar91 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
          auVar107 = vfmadd213ps_avx512vl(auVar119,auVar119,ZEXT1632(auVar91));
          auVar23 = vfmadd231ps_fma(auVar107,auVar120,auVar120);
          auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar23));
          auVar232._8_4_ = 0xbf000000;
          auVar232._0_8_ = 0xbf000000bf000000;
          auVar232._12_4_ = 0xbf000000;
          auVar232._16_4_ = 0xbf000000;
          auVar232._20_4_ = 0xbf000000;
          auVar232._24_4_ = 0xbf000000;
          auVar232._28_4_ = 0xbf000000;
          fVar167 = auVar107._0_4_;
          fVar218 = auVar107._4_4_;
          fVar219 = auVar107._8_4_;
          fVar220 = auVar107._12_4_;
          fVar166 = auVar107._16_4_;
          fVar179 = auVar107._20_4_;
          fVar78 = auVar107._24_4_;
          auVar43._4_4_ = fVar218 * fVar218 * fVar218 * auVar23._4_4_ * -0.5;
          auVar43._0_4_ = fVar167 * fVar167 * fVar167 * auVar23._0_4_ * -0.5;
          auVar43._8_4_ = fVar219 * fVar219 * fVar219 * auVar23._8_4_ * -0.5;
          auVar43._12_4_ = fVar220 * fVar220 * fVar220 * auVar23._12_4_ * -0.5;
          auVar43._16_4_ = fVar166 * fVar166 * fVar166 * -0.0;
          auVar43._20_4_ = fVar179 * fVar179 * fVar179 * -0.0;
          auVar43._24_4_ = fVar78 * fVar78 * fVar78 * -0.0;
          auVar43._28_4_ = auVar120._28_4_;
          auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar107 = vfmadd231ps_avx512vl(auVar43,auVar105,auVar107);
          auVar44._4_4_ = auVar120._4_4_ * auVar107._4_4_;
          auVar44._0_4_ = auVar120._0_4_ * auVar107._0_4_;
          auVar44._8_4_ = auVar120._8_4_ * auVar107._8_4_;
          auVar44._12_4_ = auVar120._12_4_ * auVar107._12_4_;
          auVar44._16_4_ = auVar120._16_4_ * auVar107._16_4_;
          auVar44._20_4_ = auVar120._20_4_ * auVar107._20_4_;
          auVar44._24_4_ = auVar120._24_4_ * auVar107._24_4_;
          auVar44._28_4_ = 0;
          auVar45._4_4_ = auVar107._4_4_ * -auVar119._4_4_;
          auVar45._0_4_ = auVar107._0_4_ * -auVar119._0_4_;
          auVar45._8_4_ = auVar107._8_4_ * -auVar119._8_4_;
          auVar45._12_4_ = auVar107._12_4_ * -auVar119._12_4_;
          auVar45._16_4_ = auVar107._16_4_ * -auVar119._16_4_;
          auVar45._20_4_ = auVar107._20_4_ * -auVar119._20_4_;
          auVar45._24_4_ = auVar107._24_4_ * -auVar119._24_4_;
          auVar45._28_4_ = auVar120._28_4_;
          auVar104 = vmulps_avx512vl(auVar107,ZEXT1632(auVar91));
          auVar94 = ZEXT1632(auVar91);
          auVar107 = vfmadd213ps_avx512vl(auVar121,auVar121,auVar94);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar122,auVar122);
          auVar103 = vrsqrt14ps_avx512vl(auVar107);
          auVar107 = vmulps_avx512vl(auVar107,auVar232);
          fVar167 = auVar103._0_4_;
          fVar218 = auVar103._4_4_;
          fVar219 = auVar103._8_4_;
          fVar220 = auVar103._12_4_;
          fVar166 = auVar103._16_4_;
          fVar179 = auVar103._20_4_;
          fVar78 = auVar103._24_4_;
          auVar46._4_4_ = fVar218 * fVar218 * fVar218 * auVar107._4_4_;
          auVar46._0_4_ = fVar167 * fVar167 * fVar167 * auVar107._0_4_;
          auVar46._8_4_ = fVar219 * fVar219 * fVar219 * auVar107._8_4_;
          auVar46._12_4_ = fVar220 * fVar220 * fVar220 * auVar107._12_4_;
          auVar46._16_4_ = fVar166 * fVar166 * fVar166 * auVar107._16_4_;
          auVar46._20_4_ = fVar179 * fVar179 * fVar179 * auVar107._20_4_;
          auVar46._24_4_ = fVar78 * fVar78 * fVar78 * auVar107._24_4_;
          auVar46._28_4_ = auVar107._28_4_;
          auVar107 = vfmadd231ps_avx512vl(auVar46,auVar105,auVar103);
          auVar47._4_4_ = auVar122._4_4_ * auVar107._4_4_;
          auVar47._0_4_ = auVar122._0_4_ * auVar107._0_4_;
          auVar47._8_4_ = auVar122._8_4_ * auVar107._8_4_;
          auVar47._12_4_ = auVar122._12_4_ * auVar107._12_4_;
          auVar47._16_4_ = auVar122._16_4_ * auVar107._16_4_;
          auVar47._20_4_ = auVar122._20_4_ * auVar107._20_4_;
          auVar47._24_4_ = auVar122._24_4_ * auVar107._24_4_;
          auVar47._28_4_ = auVar103._28_4_;
          auVar48._4_4_ = auVar107._4_4_ * auVar106._4_4_;
          auVar48._0_4_ = auVar107._0_4_ * auVar106._0_4_;
          auVar48._8_4_ = auVar107._8_4_ * auVar106._8_4_;
          auVar48._12_4_ = auVar107._12_4_ * auVar106._12_4_;
          auVar48._16_4_ = auVar107._16_4_ * auVar106._16_4_;
          auVar48._20_4_ = auVar107._20_4_ * auVar106._20_4_;
          auVar48._24_4_ = auVar107._24_4_ * auVar106._24_4_;
          auVar48._28_4_ = auVar106._28_4_;
          auVar106 = vmulps_avx512vl(auVar107,auVar94);
          auVar23 = vfmadd213ps_fma(auVar44,auVar97,ZEXT1632(auVar80));
          auVar24 = vfmadd213ps_fma(auVar45,auVar97,ZEXT1632(auVar81));
          auVar105 = vfmadd213ps_avx512vl(auVar104,auVar97,auVar93);
          auVar103 = vfmadd213ps_avx512vl(auVar47,auVar98,ZEXT1632(auVar89));
          auVar26 = vfnmadd213ps_fma(auVar44,auVar97,ZEXT1632(auVar80));
          auVar80 = vfmadd213ps_fma(auVar48,auVar98,ZEXT1632(auVar22));
          auVar27 = vfnmadd213ps_fma(auVar45,auVar97,ZEXT1632(auVar81));
          auVar81 = vfmadd213ps_fma(auVar106,auVar98,auVar92);
          auVar235 = vfnmadd231ps_fma(auVar93,auVar97,auVar104);
          auVar85 = vfnmadd213ps_fma(auVar47,auVar98,ZEXT1632(auVar89));
          auVar88 = vfnmadd213ps_fma(auVar48,auVar98,ZEXT1632(auVar22));
          auVar90 = vfnmadd231ps_fma(auVar92,auVar98,auVar106);
          auVar92 = vsubps_avx512vl(auVar103,ZEXT1632(auVar26));
          auVar106 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar27));
          auVar107 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar235));
          auVar49._4_4_ = auVar106._4_4_ * auVar235._4_4_;
          auVar49._0_4_ = auVar106._0_4_ * auVar235._0_4_;
          auVar49._8_4_ = auVar106._8_4_ * auVar235._8_4_;
          auVar49._12_4_ = auVar106._12_4_ * auVar235._12_4_;
          auVar49._16_4_ = auVar106._16_4_ * 0.0;
          auVar49._20_4_ = auVar106._20_4_ * 0.0;
          auVar49._24_4_ = auVar106._24_4_ * 0.0;
          auVar49._28_4_ = auVar104._28_4_;
          auVar89 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar27),auVar107);
          auVar50._4_4_ = auVar107._4_4_ * auVar26._4_4_;
          auVar50._0_4_ = auVar107._0_4_ * auVar26._0_4_;
          auVar50._8_4_ = auVar107._8_4_ * auVar26._8_4_;
          auVar50._12_4_ = auVar107._12_4_ * auVar26._12_4_;
          auVar50._16_4_ = auVar107._16_4_ * 0.0;
          auVar50._20_4_ = auVar107._20_4_ * 0.0;
          auVar50._24_4_ = auVar107._24_4_ * 0.0;
          auVar50._28_4_ = auVar107._28_4_;
          auVar22 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar235),auVar92);
          auVar51._4_4_ = auVar27._4_4_ * auVar92._4_4_;
          auVar51._0_4_ = auVar27._0_4_ * auVar92._0_4_;
          auVar51._8_4_ = auVar27._8_4_ * auVar92._8_4_;
          auVar51._12_4_ = auVar27._12_4_ * auVar92._12_4_;
          auVar51._16_4_ = auVar92._16_4_ * 0.0;
          auVar51._20_4_ = auVar92._20_4_ * 0.0;
          auVar51._24_4_ = auVar92._24_4_ * 0.0;
          auVar51._28_4_ = auVar92._28_4_;
          auVar25 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar26),auVar106);
          auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar25),auVar94,ZEXT1632(auVar22));
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar94,ZEXT1632(auVar89));
          auVar100 = ZEXT1632(auVar91);
          uVar68 = vcmpps_avx512vl(auVar106,auVar100,2);
          bVar67 = (byte)uVar68;
          fVar133 = (float)((uint)(bVar67 & 1) * auVar23._0_4_ |
                           (uint)!(bool)(bVar67 & 1) * auVar85._0_4_);
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          fVar135 = (float)((uint)bVar14 * auVar23._4_4_ | (uint)!bVar14 * auVar85._4_4_);
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          fVar138 = (float)((uint)bVar14 * auVar23._8_4_ | (uint)!bVar14 * auVar85._8_4_);
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          fVar139 = (float)((uint)bVar14 * auVar23._12_4_ | (uint)!bVar14 * auVar85._12_4_);
          auVar94 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar138,CONCAT44(fVar135,fVar133))));
          fVar134 = (float)((uint)(bVar67 & 1) * auVar24._0_4_ |
                           (uint)!(bool)(bVar67 & 1) * auVar88._0_4_);
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          fVar137 = (float)((uint)bVar14 * auVar24._4_4_ | (uint)!bVar14 * auVar88._4_4_);
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          fVar136 = (float)((uint)bVar14 * auVar24._8_4_ | (uint)!bVar14 * auVar88._8_4_);
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          fVar140 = (float)((uint)bVar14 * auVar24._12_4_ | (uint)!bVar14 * auVar88._12_4_);
          auVar95 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar136,CONCAT44(fVar137,fVar134))));
          auVar123._0_4_ =
               (float)((uint)(bVar67 & 1) * auVar105._0_4_ |
                      (uint)!(bool)(bVar67 & 1) * auVar90._0_4_);
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar14 * auVar105._4_4_ | (uint)!bVar14 * auVar90._4_4_);
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar14 * auVar105._8_4_ | (uint)!bVar14 * auVar90._8_4_);
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar14 * auVar105._12_4_ | (uint)!bVar14 * auVar90._12_4_)
          ;
          fVar219 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar105._16_4_);
          auVar123._16_4_ = fVar219;
          fVar218 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar105._20_4_);
          auVar123._20_4_ = fVar218;
          fVar167 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar105._24_4_);
          auVar123._24_4_ = fVar167;
          iVar1 = (uint)(byte)(uVar68 >> 7) * auVar105._28_4_;
          auVar123._28_4_ = iVar1;
          auVar106 = vblendmps_avx512vl(ZEXT1632(auVar26),auVar103);
          auVar124._0_4_ =
               (uint)(bVar67 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar89._0_4_;
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * auVar89._4_4_;
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * auVar89._8_4_;
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * auVar89._12_4_;
          auVar124._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * auVar106._16_4_;
          auVar124._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * auVar106._20_4_;
          auVar124._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * auVar106._24_4_;
          auVar124._28_4_ = (uint)(byte)(uVar68 >> 7) * auVar106._28_4_;
          auVar106 = vblendmps_avx512vl(ZEXT1632(auVar27),ZEXT1632(auVar80));
          auVar125._0_4_ =
               (float)((uint)(bVar67 & 1) * auVar106._0_4_ |
                      (uint)!(bool)(bVar67 & 1) * auVar23._0_4_);
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * auVar23._4_4_);
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * auVar23._8_4_);
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * auVar23._12_4_)
          ;
          fVar166 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar106._16_4_);
          auVar125._16_4_ = fVar166;
          fVar220 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar106._20_4_);
          auVar125._20_4_ = fVar220;
          fVar179 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar106._24_4_);
          auVar125._24_4_ = fVar179;
          auVar125._28_4_ = (uint)(byte)(uVar68 >> 7) * auVar106._28_4_;
          auVar106 = vblendmps_avx512vl(ZEXT1632(auVar235),ZEXT1632(auVar81));
          auVar126._0_4_ =
               (float)((uint)(bVar67 & 1) * auVar106._0_4_ |
                      (uint)!(bool)(bVar67 & 1) * auVar24._0_4_);
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * auVar24._4_4_);
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * auVar24._8_4_);
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * auVar24._12_4_)
          ;
          fVar132 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar106._16_4_);
          auVar126._16_4_ = fVar132;
          fVar79 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar106._20_4_);
          auVar126._20_4_ = fVar79;
          fVar78 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar106._24_4_);
          auVar126._24_4_ = fVar78;
          iVar2 = (uint)(byte)(uVar68 >> 7) * auVar106._28_4_;
          auVar126._28_4_ = iVar2;
          auVar127._0_4_ =
               (uint)(bVar67 & 1) * (int)auVar26._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar103._0_4_;
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar14 * (int)auVar26._4_4_ | (uint)!bVar14 * auVar103._4_4_;
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar14 * (int)auVar26._8_4_ | (uint)!bVar14 * auVar103._8_4_;
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar14 * (int)auVar26._12_4_ | (uint)!bVar14 * auVar103._12_4_;
          auVar127._16_4_ = (uint)!(bool)((byte)(uVar68 >> 4) & 1) * auVar103._16_4_;
          auVar127._20_4_ = (uint)!(bool)((byte)(uVar68 >> 5) & 1) * auVar103._20_4_;
          auVar127._24_4_ = (uint)!(bool)((byte)(uVar68 >> 6) & 1) * auVar103._24_4_;
          auVar127._28_4_ = (uint)!SUB81(uVar68 >> 7,0) * auVar103._28_4_;
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar68 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar68 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar68 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar103 = vsubps_avx512vl(auVar127,auVar94);
          auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar27._12_4_ |
                                                   (uint)!bVar18 * auVar80._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar27._8_4_ |
                                                            (uint)!bVar16 * auVar80._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar27._4_4_ |
                                                                     (uint)!bVar14 * auVar80._4_4_,
                                                                     (uint)(bVar67 & 1) *
                                                                     (int)auVar27._0_4_ |
                                                                     (uint)!(bool)(bVar67 & 1) *
                                                                     auVar80._0_4_)))),auVar95);
          auVar210 = ZEXT3264(auVar107);
          auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar235._12_4_ |
                                                   (uint)!bVar19 * auVar81._12_4_,
                                                   CONCAT48((uint)bVar17 * (int)auVar235._8_4_ |
                                                            (uint)!bVar17 * auVar81._8_4_,
                                                            CONCAT44((uint)bVar15 *
                                                                     (int)auVar235._4_4_ |
                                                                     (uint)!bVar15 * auVar81._4_4_,
                                                                     (uint)(bVar67 & 1) *
                                                                     (int)auVar235._0_4_ |
                                                                     (uint)!(bool)(bVar67 & 1) *
                                                                     auVar81._0_4_)))),auVar123);
          auVar104 = vsubps_avx(auVar94,auVar124);
          auVar215 = ZEXT3264(auVar104);
          auVar92 = vsubps_avx(auVar95,auVar125);
          auVar93 = vsubps_avx(auVar123,auVar126);
          auVar52._4_4_ = auVar105._4_4_ * fVar135;
          auVar52._0_4_ = auVar105._0_4_ * fVar133;
          auVar52._8_4_ = auVar105._8_4_ * fVar138;
          auVar52._12_4_ = auVar105._12_4_ * fVar139;
          auVar52._16_4_ = auVar105._16_4_ * 0.0;
          auVar52._20_4_ = auVar105._20_4_ * 0.0;
          auVar52._24_4_ = auVar105._24_4_ * 0.0;
          auVar52._28_4_ = 0;
          auVar80 = vfmsub231ps_fma(auVar52,auVar123,auVar103);
          auVar188._0_4_ = fVar134 * auVar103._0_4_;
          auVar188._4_4_ = fVar137 * auVar103._4_4_;
          auVar188._8_4_ = fVar136 * auVar103._8_4_;
          auVar188._12_4_ = fVar140 * auVar103._12_4_;
          auVar188._16_4_ = auVar103._16_4_ * 0.0;
          auVar188._20_4_ = auVar103._20_4_ * 0.0;
          auVar188._24_4_ = auVar103._24_4_ * 0.0;
          auVar188._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar188,auVar94,auVar107);
          auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar100,ZEXT1632(auVar80));
          auVar194._0_4_ = auVar107._0_4_ * auVar123._0_4_;
          auVar194._4_4_ = auVar107._4_4_ * auVar123._4_4_;
          auVar194._8_4_ = auVar107._8_4_ * auVar123._8_4_;
          auVar194._12_4_ = auVar107._12_4_ * auVar123._12_4_;
          auVar194._16_4_ = auVar107._16_4_ * fVar219;
          auVar194._20_4_ = auVar107._20_4_ * fVar218;
          auVar194._24_4_ = auVar107._24_4_ * fVar167;
          auVar194._28_4_ = 0;
          auVar80 = vfmsub231ps_fma(auVar194,auVar95,auVar105);
          auVar96 = vfmadd231ps_avx512vl(auVar106,auVar100,ZEXT1632(auVar80));
          auVar106 = vmulps_avx512vl(auVar93,auVar124);
          auVar106 = vfmsub231ps_avx512vl(auVar106,auVar104,auVar126);
          auVar53._4_4_ = auVar92._4_4_ * auVar126._4_4_;
          auVar53._0_4_ = auVar92._0_4_ * auVar126._0_4_;
          auVar53._8_4_ = auVar92._8_4_ * auVar126._8_4_;
          auVar53._12_4_ = auVar92._12_4_ * auVar126._12_4_;
          auVar53._16_4_ = auVar92._16_4_ * fVar132;
          auVar53._20_4_ = auVar92._20_4_ * fVar79;
          auVar53._24_4_ = auVar92._24_4_ * fVar78;
          auVar53._28_4_ = iVar2;
          auVar80 = vfmsub231ps_fma(auVar53,auVar125,auVar93);
          auVar195._0_4_ = auVar125._0_4_ * auVar104._0_4_;
          auVar195._4_4_ = auVar125._4_4_ * auVar104._4_4_;
          auVar195._8_4_ = auVar125._8_4_ * auVar104._8_4_;
          auVar195._12_4_ = auVar125._12_4_ * auVar104._12_4_;
          auVar195._16_4_ = fVar166 * auVar104._16_4_;
          auVar195._20_4_ = fVar220 * auVar104._20_4_;
          auVar195._24_4_ = fVar179 * auVar104._24_4_;
          auVar195._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar195,auVar92,auVar124);
          auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar100,auVar106);
          auVar99 = vfmadd231ps_avx512vl(auVar106,auVar100,ZEXT1632(auVar80));
          auVar198 = ZEXT3264(auVar99);
          auVar106 = vmaxps_avx(auVar96,auVar99);
          uVar160 = vcmpps_avx512vl(auVar106,auVar100,2);
          bVar76 = bVar76 & (byte)uVar160;
          if (bVar76 != 0) {
            uVar141 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar233._4_4_ = uVar141;
            auVar233._0_4_ = uVar141;
            auVar233._8_4_ = uVar141;
            auVar233._12_4_ = uVar141;
            auVar233._16_4_ = uVar141;
            auVar233._20_4_ = uVar141;
            auVar233._24_4_ = uVar141;
            auVar233._28_4_ = uVar141;
            auVar234 = ZEXT3264(auVar233);
            auVar54._4_4_ = auVar93._4_4_ * auVar107._4_4_;
            auVar54._0_4_ = auVar93._0_4_ * auVar107._0_4_;
            auVar54._8_4_ = auVar93._8_4_ * auVar107._8_4_;
            auVar54._12_4_ = auVar93._12_4_ * auVar107._12_4_;
            auVar54._16_4_ = auVar93._16_4_ * auVar107._16_4_;
            auVar54._20_4_ = auVar93._20_4_ * auVar107._20_4_;
            auVar54._24_4_ = auVar93._24_4_ * auVar107._24_4_;
            auVar54._28_4_ = auVar106._28_4_;
            auVar22 = vfmsub231ps_fma(auVar54,auVar92,auVar105);
            auVar55._4_4_ = auVar105._4_4_ * auVar104._4_4_;
            auVar55._0_4_ = auVar105._0_4_ * auVar104._0_4_;
            auVar55._8_4_ = auVar105._8_4_ * auVar104._8_4_;
            auVar55._12_4_ = auVar105._12_4_ * auVar104._12_4_;
            auVar55._16_4_ = auVar105._16_4_ * auVar104._16_4_;
            auVar55._20_4_ = auVar105._20_4_ * auVar104._20_4_;
            auVar55._24_4_ = auVar105._24_4_ * auVar104._24_4_;
            auVar55._28_4_ = auVar105._28_4_;
            auVar89 = vfmsub231ps_fma(auVar55,auVar103,auVar93);
            auVar56._4_4_ = auVar92._4_4_ * auVar103._4_4_;
            auVar56._0_4_ = auVar92._0_4_ * auVar103._0_4_;
            auVar56._8_4_ = auVar92._8_4_ * auVar103._8_4_;
            auVar56._12_4_ = auVar92._12_4_ * auVar103._12_4_;
            auVar56._16_4_ = auVar92._16_4_ * auVar103._16_4_;
            auVar56._20_4_ = auVar92._20_4_ * auVar103._20_4_;
            auVar56._24_4_ = auVar92._24_4_ * auVar103._24_4_;
            auVar56._28_4_ = auVar92._28_4_;
            auVar23 = vfmsub231ps_fma(auVar56,auVar104,auVar107);
            auVar80 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar23));
            auVar81 = vfmadd231ps_fma(ZEXT1632(auVar80),ZEXT1632(auVar22),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar106 = vrcp14ps_avx512vl(ZEXT1632(auVar81));
            auVar34._8_4_ = 0x3f800000;
            auVar34._0_8_ = 0x3f8000003f800000;
            auVar34._12_4_ = 0x3f800000;
            auVar34._16_4_ = 0x3f800000;
            auVar34._20_4_ = 0x3f800000;
            auVar34._24_4_ = 0x3f800000;
            auVar34._28_4_ = 0x3f800000;
            auVar107 = vfnmadd213ps_avx512vl(auVar106,ZEXT1632(auVar81),auVar34);
            auVar80 = vfmadd132ps_fma(auVar107,auVar106,auVar106);
            auVar210 = ZEXT1664(auVar80);
            auVar57._4_4_ = auVar23._4_4_ * auVar123._4_4_;
            auVar57._0_4_ = auVar23._0_4_ * auVar123._0_4_;
            auVar57._8_4_ = auVar23._8_4_ * auVar123._8_4_;
            auVar57._12_4_ = auVar23._12_4_ * auVar123._12_4_;
            auVar57._16_4_ = fVar219 * 0.0;
            auVar57._20_4_ = fVar218 * 0.0;
            auVar57._24_4_ = fVar167 * 0.0;
            auVar57._28_4_ = iVar1;
            auVar89 = vfmadd231ps_fma(auVar57,auVar95,ZEXT1632(auVar89));
            auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar94,ZEXT1632(auVar22));
            fVar167 = auVar80._0_4_;
            fVar218 = auVar80._4_4_;
            fVar219 = auVar80._8_4_;
            fVar220 = auVar80._12_4_;
            local_5e0._28_4_ = auVar106._28_4_;
            local_5e0._0_28_ =
                 ZEXT1628(CONCAT412(auVar89._12_4_ * fVar220,
                                    CONCAT48(auVar89._8_4_ * fVar219,
                                             CONCAT44(auVar89._4_4_ * fVar218,
                                                      auVar89._0_4_ * fVar167))));
            auVar215 = ZEXT3264(local_5e0);
            uVar160 = vcmpps_avx512vl(local_5e0,auVar233,2);
            auVar64._4_4_ = uStack_55c;
            auVar64._0_4_ = local_560;
            auVar64._8_4_ = uStack_558;
            auVar64._12_4_ = uStack_554;
            auVar64._16_4_ = uStack_550;
            auVar64._20_4_ = uStack_54c;
            auVar64._24_4_ = uStack_548;
            auVar64._28_4_ = uStack_544;
            uVar28 = vcmpps_avx512vl(local_5e0,auVar64,0xd);
            bVar76 = (byte)uVar160 & (byte)uVar28 & bVar76;
            if (bVar76 != 0) {
              uVar77 = vcmpps_avx512vl(ZEXT1632(auVar81),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar77 = bVar76 & uVar77;
              if ((char)uVar77 != '\0') {
                fVar166 = auVar96._0_4_ * fVar167;
                fVar179 = auVar96._4_4_ * fVar218;
                auVar58._4_4_ = fVar179;
                auVar58._0_4_ = fVar166;
                fVar78 = auVar96._8_4_ * fVar219;
                auVar58._8_4_ = fVar78;
                fVar79 = auVar96._12_4_ * fVar220;
                auVar58._12_4_ = fVar79;
                fVar132 = auVar96._16_4_ * 0.0;
                auVar58._16_4_ = fVar132;
                fVar133 = auVar96._20_4_ * 0.0;
                auVar58._20_4_ = fVar133;
                fVar134 = auVar96._24_4_ * 0.0;
                auVar58._24_4_ = fVar134;
                auVar58._28_4_ = auVar96._28_4_;
                auVar178._8_4_ = 0x3f800000;
                auVar178._0_8_ = 0x3f8000003f800000;
                auVar178._12_4_ = 0x3f800000;
                auVar178._16_4_ = 0x3f800000;
                auVar178._20_4_ = 0x3f800000;
                auVar178._24_4_ = 0x3f800000;
                auVar178._28_4_ = 0x3f800000;
                auVar106 = vsubps_avx(auVar178,auVar58);
                local_400._0_4_ =
                     (float)((uint)(bVar67 & 1) * (int)fVar166 |
                            (uint)!(bool)(bVar67 & 1) * auVar106._0_4_);
                bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
                local_400._4_4_ =
                     (float)((uint)bVar14 * (int)fVar179 | (uint)!bVar14 * auVar106._4_4_);
                bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
                local_400._8_4_ =
                     (float)((uint)bVar14 * (int)fVar78 | (uint)!bVar14 * auVar106._8_4_);
                bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
                local_400._12_4_ =
                     (float)((uint)bVar14 * (int)fVar79 | (uint)!bVar14 * auVar106._12_4_);
                bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
                local_400._16_4_ =
                     (float)((uint)bVar14 * (int)fVar132 | (uint)!bVar14 * auVar106._16_4_);
                bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
                local_400._20_4_ =
                     (float)((uint)bVar14 * (int)fVar133 | (uint)!bVar14 * auVar106._20_4_);
                bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
                local_400._24_4_ =
                     (float)((uint)bVar14 * (int)fVar134 | (uint)!bVar14 * auVar106._24_4_);
                bVar14 = SUB81(uVar68 >> 7,0);
                local_400._28_4_ =
                     (float)((uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * auVar106._28_4_);
                auVar106 = vsubps_avx(auVar98,auVar97);
                auVar80 = vfmadd213ps_fma(auVar106,local_400,auVar97);
                uVar141 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar35._4_4_ = uVar141;
                auVar35._0_4_ = uVar141;
                auVar35._8_4_ = uVar141;
                auVar35._12_4_ = uVar141;
                auVar35._16_4_ = uVar141;
                auVar35._20_4_ = uVar141;
                auVar35._24_4_ = uVar141;
                auVar35._28_4_ = uVar141;
                auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar80._12_4_ + auVar80._12_4_,
                                                              CONCAT48(auVar80._8_4_ + auVar80._8_4_
                                                                       ,CONCAT44(auVar80._4_4_ +
                                                                                 auVar80._4_4_,
                                                                                 auVar80._0_4_ +
                                                                                 auVar80._0_4_)))),
                                           auVar35);
                uVar29 = vcmpps_avx512vl(local_5e0,auVar106,6);
                uVar77 = uVar77 & uVar29;
                bVar76 = (byte)uVar77;
                if (bVar76 != 0) {
                  auVar165._0_4_ = auVar99._0_4_ * fVar167;
                  auVar165._4_4_ = auVar99._4_4_ * fVar218;
                  auVar165._8_4_ = auVar99._8_4_ * fVar219;
                  auVar165._12_4_ = auVar99._12_4_ * fVar220;
                  auVar165._16_4_ = auVar99._16_4_ * 0.0;
                  auVar165._20_4_ = auVar99._20_4_ * 0.0;
                  auVar165._24_4_ = auVar99._24_4_ * 0.0;
                  auVar165._28_4_ = 0;
                  auVar189._8_4_ = 0x3f800000;
                  auVar189._0_8_ = 0x3f8000003f800000;
                  auVar189._12_4_ = 0x3f800000;
                  auVar189._16_4_ = 0x3f800000;
                  auVar189._20_4_ = 0x3f800000;
                  auVar189._24_4_ = 0x3f800000;
                  auVar189._28_4_ = 0x3f800000;
                  auVar106 = vsubps_avx(auVar189,auVar165);
                  auVar128._0_4_ =
                       (uint)(bVar67 & 1) * (int)auVar165._0_4_ |
                       (uint)!(bool)(bVar67 & 1) * auVar106._0_4_;
                  bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
                  auVar128._4_4_ =
                       (uint)bVar14 * (int)auVar165._4_4_ | (uint)!bVar14 * auVar106._4_4_;
                  bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
                  auVar128._8_4_ =
                       (uint)bVar14 * (int)auVar165._8_4_ | (uint)!bVar14 * auVar106._8_4_;
                  bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
                  auVar128._12_4_ =
                       (uint)bVar14 * (int)auVar165._12_4_ | (uint)!bVar14 * auVar106._12_4_;
                  bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
                  auVar128._16_4_ =
                       (uint)bVar14 * (int)auVar165._16_4_ | (uint)!bVar14 * auVar106._16_4_;
                  bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
                  auVar128._20_4_ =
                       (uint)bVar14 * (int)auVar165._20_4_ | (uint)!bVar14 * auVar106._20_4_;
                  bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
                  auVar128._24_4_ =
                       (uint)bVar14 * (int)auVar165._24_4_ | (uint)!bVar14 * auVar106._24_4_;
                  auVar128._28_4_ = (uint)!SUB81(uVar68 >> 7,0) * auVar106._28_4_;
                  auVar36._8_4_ = 0x40000000;
                  auVar36._0_8_ = 0x4000000040000000;
                  auVar36._12_4_ = 0x40000000;
                  auVar36._16_4_ = 0x40000000;
                  auVar36._20_4_ = 0x40000000;
                  auVar36._24_4_ = 0x40000000;
                  auVar36._28_4_ = 0x40000000;
                  local_3e0 = vfmsub132ps_avx512vl(auVar128,auVar189,auVar36);
                  local_3a0 = (undefined4)lVar72;
                  local_390 = local_670;
                  uStack_388 = uStack_668;
                  local_380 = local_690;
                  uStack_378 = uStack_688;
                  local_370 = local_6a0;
                  uStack_368 = uStack_698;
                  local_360 = local_680;
                  uStack_358 = uStack_678;
                  pGVar73 = (context->scene->geometries).items[uVar74].ptr;
                  if ((pGVar73->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    auVar80 = vcvtsi2ss_avx512f(auVar91,local_3a0);
                    fVar167 = auVar80._0_4_;
                    local_340[0] = (fVar167 + local_400._0_4_ + 0.0) * local_100;
                    local_340[1] = (fVar167 + local_400._4_4_ + 1.0) * fStack_fc;
                    local_340[2] = (fVar167 + local_400._8_4_ + 2.0) * fStack_f8;
                    local_340[3] = (fVar167 + local_400._12_4_ + 3.0) * fStack_f4;
                    fStack_330 = (fVar167 + local_400._16_4_ + 4.0) * fStack_f0;
                    fStack_32c = (fVar167 + local_400._20_4_ + 5.0) * fStack_ec;
                    fStack_328 = (fVar167 + local_400._24_4_ + 6.0) * fStack_e8;
                    fStack_324 = fVar167 + local_400._28_4_ + 7.0;
                    local_320 = local_3e0;
                    local_300 = local_5e0;
                    auVar152._8_4_ = 0x7f800000;
                    auVar152._0_8_ = 0x7f8000007f800000;
                    auVar152._12_4_ = 0x7f800000;
                    auVar152._16_4_ = 0x7f800000;
                    auVar152._20_4_ = 0x7f800000;
                    auVar152._24_4_ = 0x7f800000;
                    auVar152._28_4_ = 0x7f800000;
                    auVar106 = vblendmps_avx512vl(auVar152,local_5e0);
                    auVar129._0_4_ =
                         (uint)(bVar76 & 1) * auVar106._0_4_ |
                         (uint)!(bool)(bVar76 & 1) * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar77 >> 1) & 1);
                    auVar129._4_4_ = (uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar77 >> 2) & 1);
                    auVar129._8_4_ = (uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
                    auVar129._12_4_ = (uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar77 >> 4) & 1);
                    auVar129._16_4_ = (uint)bVar14 * auVar106._16_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar77 >> 5) & 1);
                    auVar129._20_4_ = (uint)bVar14 * auVar106._20_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar77 >> 6) & 1);
                    auVar129._24_4_ = (uint)bVar14 * auVar106._24_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = SUB81(uVar77 >> 7,0);
                    auVar129._28_4_ = (uint)bVar14 * auVar106._28_4_ | (uint)!bVar14 * 0x7f800000;
                    auVar106 = vshufps_avx(auVar129,auVar129,0xb1);
                    auVar106 = vminps_avx(auVar129,auVar106);
                    auVar107 = vshufpd_avx(auVar106,auVar106,5);
                    auVar106 = vminps_avx(auVar106,auVar107);
                    auVar107 = vpermpd_avx2(auVar106,0x4e);
                    auVar106 = vminps_avx(auVar106,auVar107);
                    uVar160 = vcmpps_avx512vl(auVar129,auVar106,0);
                    uVar69 = (uint)uVar77;
                    if (((byte)uVar160 & bVar76) != 0) {
                      uVar69 = (uint)((byte)uVar160 & bVar76);
                    }
                    uVar70 = 0;
                    for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
                      uVar70 = uVar70 + 1;
                    }
                    uVar68 = (ulong)uVar70;
                    pGVar66 = pGVar73;
                    local_3c0 = local_5e0;
                    local_39c = iVar8;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar73->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      do {
                        local_630 = pGVar66;
                        local_1c0 = local_340[uVar68];
                        local_1a0 = *(undefined4 *)(local_320 + uVar68 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_300 + uVar68 * 4);
                        local_660.context = context->user;
                        fVar218 = 1.0 - local_1c0;
                        fVar167 = fVar218 * fVar218 * -3.0;
                        auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * fVar218)),
                                                  ZEXT416((uint)(local_1c0 * fVar218)),
                                                  ZEXT416(0xc0000000));
                        auVar81 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar218)),
                                                  ZEXT416((uint)(local_1c0 * local_1c0)),
                                                  ZEXT416(0x40000000));
                        fVar218 = auVar80._0_4_ * 3.0;
                        fVar219 = auVar81._0_4_ * 3.0;
                        fVar220 = local_1c0 * local_1c0 * 3.0;
                        auVar204._0_4_ = fVar220 * fVar157;
                        auVar204._4_4_ = fVar220 * fVar158;
                        auVar204._8_4_ = fVar220 * fVar159;
                        auVar204._12_4_ = fVar220 * fVar65;
                        auVar145._4_4_ = fVar219;
                        auVar145._0_4_ = fVar219;
                        auVar145._8_4_ = fVar219;
                        auVar145._12_4_ = fVar219;
                        auVar80 = vfmadd132ps_fma(auVar145,auVar204,auVar87);
                        auVar185._4_4_ = fVar218;
                        auVar185._0_4_ = fVar218;
                        auVar185._8_4_ = fVar218;
                        auVar185._12_4_ = fVar218;
                        auVar80 = vfmadd132ps_fma(auVar185,auVar80,auVar86);
                        auVar146._4_4_ = fVar167;
                        auVar146._0_4_ = fVar167;
                        auVar146._8_4_ = fVar167;
                        auVar146._12_4_ = fVar167;
                        auVar80 = vfmadd132ps_fma(auVar146,auVar80,auVar21);
                        local_220 = auVar80._0_4_;
                        auVar196._8_4_ = 1;
                        auVar196._0_8_ = 0x100000001;
                        auVar196._12_4_ = 1;
                        auVar196._16_4_ = 1;
                        auVar196._20_4_ = 1;
                        auVar196._24_4_ = 1;
                        auVar196._28_4_ = 1;
                        local_200 = vpermps_avx2(auVar196,ZEXT1632(auVar80));
                        auVar198 = ZEXT3264(local_200);
                        auVar205._8_4_ = 2;
                        auVar205._0_8_ = 0x200000002;
                        auVar205._12_4_ = 2;
                        auVar208._16_4_ = 2;
                        auVar208._0_16_ = auVar205;
                        auVar208._20_4_ = 2;
                        auVar208._24_4_ = 2;
                        auVar208._28_4_ = 2;
                        auVar210 = ZEXT3264(auVar208);
                        local_1e0 = vpermps_avx2(auVar208,ZEXT1632(auVar80));
                        iStack_21c = local_220;
                        iStack_218 = local_220;
                        iStack_214 = local_220;
                        iStack_210 = local_220;
                        iStack_20c = local_220;
                        iStack_208 = local_220;
                        iStack_204 = local_220;
                        fStack_1bc = local_1c0;
                        fStack_1b8 = local_1c0;
                        fStack_1b4 = local_1c0;
                        fStack_1b0 = local_1c0;
                        fStack_1ac = local_1c0;
                        fStack_1a8 = local_1c0;
                        fStack_1a4 = local_1c0;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_540._0_8_;
                        uStack_178 = local_540._8_8_;
                        uStack_170 = local_540._16_8_;
                        uStack_168 = local_540._24_8_;
                        local_160 = local_580;
                        auVar106 = vpcmpeqd_avx2(local_580,local_580);
                        local_628[1] = auVar106;
                        *local_628 = auVar106;
                        local_140 = (local_660.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_660.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_620 = local_2c0;
                        local_660.valid = (int *)local_620;
                        local_660.geometryUserPtr = pGVar73->userPtr;
                        local_660.hit = (RTCHitN *)&local_220;
                        local_660.N = 8;
                        local_5c0 = auVar234._0_32_;
                        local_660.ray = (RTCRayN *)ray;
                        if (pGVar73->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar198 = ZEXT1664(local_200._0_16_);
                          auVar210 = ZEXT1664(auVar205);
                          (*pGVar73->intersectionFilterN)(&local_660);
                          auVar215 = ZEXT3264(local_5e0);
                          auVar234 = ZEXT3264(local_5c0);
                          pGVar73 = local_630;
                        }
                        if (local_620 == (undefined1  [32])0x0) {
LAB_01bf17f4:
                          *(int *)(ray + k * 4 + 0x100) = auVar234._0_4_;
                        }
                        else {
                          p_Var13 = context->args->filter;
                          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar73->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar198 = ZEXT1664(auVar198._0_16_);
                            auVar210 = ZEXT1664(auVar210._0_16_);
                            (*p_Var13)(&local_660);
                            auVar215 = ZEXT3264(local_5e0);
                            auVar234 = ZEXT3264(local_5c0);
                            pGVar73 = local_630;
                          }
                          if (local_620 == (undefined1  [32])0x0) goto LAB_01bf17f4;
                          uVar29 = vptestmd_avx512vl(local_620,local_620);
                          iVar1 = *(int *)(local_660.hit + 4);
                          iVar2 = *(int *)(local_660.hit + 8);
                          iVar59 = *(int *)(local_660.hit + 0xc);
                          iVar60 = *(int *)(local_660.hit + 0x10);
                          iVar61 = *(int *)(local_660.hit + 0x14);
                          iVar62 = *(int *)(local_660.hit + 0x18);
                          iVar63 = *(int *)(local_660.hit + 0x1c);
                          bVar76 = (byte)uVar29;
                          bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar20 = SUB81(uVar29 >> 7,0);
                          *(uint *)(local_660.ray + 0x180) =
                               (uint)(bVar76 & 1) * *(int *)local_660.hit |
                               (uint)!(bool)(bVar76 & 1) * *(int *)(local_660.ray + 0x180);
                          *(uint *)(local_660.ray + 0x184) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x184);
                          *(uint *)(local_660.ray + 0x188) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x188);
                          *(uint *)(local_660.ray + 0x18c) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x18c);
                          *(uint *)(local_660.ray + 400) =
                               (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_660.ray + 400)
                          ;
                          *(uint *)(local_660.ray + 0x194) =
                               (uint)bVar18 * iVar61 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x194);
                          *(uint *)(local_660.ray + 0x198) =
                               (uint)bVar19 * iVar62 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x198);
                          *(uint *)(local_660.ray + 0x19c) =
                               (uint)bVar20 * iVar63 |
                               (uint)!bVar20 * *(int *)(local_660.ray + 0x19c);
                          iVar1 = *(int *)(local_660.hit + 0x24);
                          iVar2 = *(int *)(local_660.hit + 0x28);
                          iVar59 = *(int *)(local_660.hit + 0x2c);
                          iVar60 = *(int *)(local_660.hit + 0x30);
                          iVar61 = *(int *)(local_660.hit + 0x34);
                          iVar62 = *(int *)(local_660.hit + 0x38);
                          iVar63 = *(int *)(local_660.hit + 0x3c);
                          bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar20 = SUB81(uVar29 >> 7,0);
                          *(uint *)(local_660.ray + 0x1a0) =
                               (uint)(bVar76 & 1) * *(int *)(local_660.hit + 0x20) |
                               (uint)!(bool)(bVar76 & 1) * *(int *)(local_660.ray + 0x1a0);
                          *(uint *)(local_660.ray + 0x1a4) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x1a4);
                          *(uint *)(local_660.ray + 0x1a8) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x1a8);
                          *(uint *)(local_660.ray + 0x1ac) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x1ac);
                          *(uint *)(local_660.ray + 0x1b0) =
                               (uint)bVar17 * iVar60 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x1b0);
                          *(uint *)(local_660.ray + 0x1b4) =
                               (uint)bVar18 * iVar61 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x1b4);
                          *(uint *)(local_660.ray + 0x1b8) =
                               (uint)bVar19 * iVar62 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1b8);
                          *(uint *)(local_660.ray + 0x1bc) =
                               (uint)bVar20 * iVar63 |
                               (uint)!bVar20 * *(int *)(local_660.ray + 0x1bc);
                          iVar1 = *(int *)(local_660.hit + 0x44);
                          iVar2 = *(int *)(local_660.hit + 0x48);
                          iVar59 = *(int *)(local_660.hit + 0x4c);
                          iVar60 = *(int *)(local_660.hit + 0x50);
                          iVar61 = *(int *)(local_660.hit + 0x54);
                          iVar62 = *(int *)(local_660.hit + 0x58);
                          iVar63 = *(int *)(local_660.hit + 0x5c);
                          bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar20 = SUB81(uVar29 >> 7,0);
                          *(uint *)(local_660.ray + 0x1c0) =
                               (uint)(bVar76 & 1) * *(int *)(local_660.hit + 0x40) |
                               (uint)!(bool)(bVar76 & 1) * *(int *)(local_660.ray + 0x1c0);
                          *(uint *)(local_660.ray + 0x1c4) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x1c4);
                          *(uint *)(local_660.ray + 0x1c8) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x1c8);
                          *(uint *)(local_660.ray + 0x1cc) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x1cc);
                          *(uint *)(local_660.ray + 0x1d0) =
                               (uint)bVar17 * iVar60 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x1d0);
                          *(uint *)(local_660.ray + 0x1d4) =
                               (uint)bVar18 * iVar61 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x1d4);
                          *(uint *)(local_660.ray + 0x1d8) =
                               (uint)bVar19 * iVar62 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1d8);
                          *(uint *)(local_660.ray + 0x1dc) =
                               (uint)bVar20 * iVar63 |
                               (uint)!bVar20 * *(int *)(local_660.ray + 0x1dc);
                          iVar1 = *(int *)(local_660.hit + 100);
                          iVar2 = *(int *)(local_660.hit + 0x68);
                          iVar59 = *(int *)(local_660.hit + 0x6c);
                          iVar60 = *(int *)(local_660.hit + 0x70);
                          iVar61 = *(int *)(local_660.hit + 0x74);
                          iVar62 = *(int *)(local_660.hit + 0x78);
                          iVar63 = *(int *)(local_660.hit + 0x7c);
                          bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar20 = SUB81(uVar29 >> 7,0);
                          *(uint *)(local_660.ray + 0x1e0) =
                               (uint)(bVar76 & 1) * *(int *)(local_660.hit + 0x60) |
                               (uint)!(bool)(bVar76 & 1) * *(int *)(local_660.ray + 0x1e0);
                          *(uint *)(local_660.ray + 0x1e4) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x1e4);
                          *(uint *)(local_660.ray + 0x1e8) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x1e8);
                          *(uint *)(local_660.ray + 0x1ec) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x1ec);
                          *(uint *)(local_660.ray + 0x1f0) =
                               (uint)bVar17 * iVar60 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x1f0);
                          *(uint *)(local_660.ray + 500) =
                               (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_660.ray + 500)
                          ;
                          *(uint *)(local_660.ray + 0x1f8) =
                               (uint)bVar19 * iVar62 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1f8);
                          *(uint *)(local_660.ray + 0x1fc) =
                               (uint)bVar20 * iVar63 |
                               (uint)!bVar20 * *(int *)(local_660.ray + 0x1fc);
                          iVar1 = *(int *)(local_660.hit + 0x84);
                          iVar2 = *(int *)(local_660.hit + 0x88);
                          iVar59 = *(int *)(local_660.hit + 0x8c);
                          iVar60 = *(int *)(local_660.hit + 0x90);
                          iVar61 = *(int *)(local_660.hit + 0x94);
                          iVar62 = *(int *)(local_660.hit + 0x98);
                          iVar63 = *(int *)(local_660.hit + 0x9c);
                          bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar20 = SUB81(uVar29 >> 7,0);
                          *(uint *)(local_660.ray + 0x200) =
                               (uint)(bVar76 & 1) * *(int *)(local_660.hit + 0x80) |
                               (uint)!(bool)(bVar76 & 1) * *(int *)(local_660.ray + 0x200);
                          *(uint *)(local_660.ray + 0x204) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x204);
                          *(uint *)(local_660.ray + 0x208) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x208);
                          *(uint *)(local_660.ray + 0x20c) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x20c);
                          *(uint *)(local_660.ray + 0x210) =
                               (uint)bVar17 * iVar60 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x210);
                          *(uint *)(local_660.ray + 0x214) =
                               (uint)bVar18 * iVar61 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x214);
                          *(uint *)(local_660.ray + 0x218) =
                               (uint)bVar19 * iVar62 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x218);
                          *(uint *)(local_660.ray + 0x21c) =
                               (uint)bVar20 * iVar63 |
                               (uint)!bVar20 * *(int *)(local_660.ray + 0x21c);
                          auVar106 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x220) = auVar106;
                          auVar106 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x240) = auVar106;
                          auVar106 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x260) = auVar106;
                          auVar106 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_660.hit + 0x100));
                          *(undefined1 (*) [32])(local_660.ray + 0x280) = auVar106;
                          auVar234 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                        }
                        bVar76 = ~(byte)(1 << ((uint)uVar68 & 0x1f)) & (byte)uVar77;
                        uVar141 = auVar234._0_4_;
                        auVar153._4_4_ = uVar141;
                        auVar153._0_4_ = uVar141;
                        auVar153._8_4_ = uVar141;
                        auVar153._12_4_ = uVar141;
                        auVar153._16_4_ = uVar141;
                        auVar153._20_4_ = uVar141;
                        auVar153._24_4_ = uVar141;
                        auVar153._28_4_ = uVar141;
                        uVar160 = vcmpps_avx512vl(auVar215._0_32_,auVar153,2);
                        if ((bVar76 & (byte)uVar160) == 0) goto LAB_01bf188c;
                        bVar76 = bVar76 & (byte)uVar160;
                        uVar77 = (ulong)bVar76;
                        auVar154._8_4_ = 0x7f800000;
                        auVar154._0_8_ = 0x7f8000007f800000;
                        auVar154._12_4_ = 0x7f800000;
                        auVar154._16_4_ = 0x7f800000;
                        auVar154._20_4_ = 0x7f800000;
                        auVar154._24_4_ = 0x7f800000;
                        auVar154._28_4_ = 0x7f800000;
                        auVar106 = vblendmps_avx512vl(auVar154,auVar215._0_32_);
                        auVar130._0_4_ =
                             (uint)(bVar76 & 1) * auVar106._0_4_ |
                             (uint)!(bool)(bVar76 & 1) * 0x7f800000;
                        bVar14 = (bool)(bVar76 >> 1 & 1);
                        auVar130._4_4_ = (uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar76 >> 2 & 1);
                        auVar130._8_4_ = (uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar76 >> 3 & 1);
                        auVar130._12_4_ =
                             (uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar76 >> 4 & 1);
                        auVar130._16_4_ =
                             (uint)bVar14 * auVar106._16_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar76 >> 5 & 1);
                        auVar130._20_4_ =
                             (uint)bVar14 * auVar106._20_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar76 >> 6 & 1);
                        auVar130._24_4_ =
                             (uint)bVar14 * auVar106._24_4_ | (uint)!bVar14 * 0x7f800000;
                        auVar130._28_4_ =
                             (uint)(bVar76 >> 7) * auVar106._28_4_ |
                             (uint)!(bool)(bVar76 >> 7) * 0x7f800000;
                        auVar106 = vshufps_avx(auVar130,auVar130,0xb1);
                        auVar106 = vminps_avx(auVar130,auVar106);
                        auVar107 = vshufpd_avx(auVar106,auVar106,5);
                        auVar106 = vminps_avx(auVar106,auVar107);
                        auVar107 = vpermpd_avx2(auVar106,0x4e);
                        auVar106 = vminps_avx(auVar106,auVar107);
                        uVar160 = vcmpps_avx512vl(auVar130,auVar106,0);
                        bVar67 = (byte)uVar160 & bVar76;
                        if (bVar67 != 0) {
                          bVar76 = bVar67;
                        }
                        uVar69 = 0;
                        for (uVar70 = (uint)bVar76; (uVar70 & 1) == 0;
                            uVar70 = uVar70 >> 1 | 0x80000000) {
                          uVar69 = uVar69 + 1;
                        }
                        uVar68 = (ulong)uVar69;
                        pGVar66 = local_630;
                      } while( true );
                    }
                    fVar167 = local_340[uVar68];
                    uVar141 = *(undefined4 *)(local_320 + uVar68 * 4);
                    fVar219 = 1.0 - fVar167;
                    fVar218 = fVar219 * fVar219 * -3.0;
                    auVar198 = ZEXT464((uint)fVar218);
                    auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * fVar219)),
                                              ZEXT416((uint)(fVar167 * fVar219)),ZEXT416(0xc0000000)
                                             );
                    auVar81 = vfmsub132ss_fma(ZEXT416((uint)(fVar167 * fVar219)),
                                              ZEXT416((uint)(fVar167 * fVar167)),ZEXT416(0x40000000)
                                             );
                    fVar219 = auVar80._0_4_ * 3.0;
                    fVar220 = auVar81._0_4_ * 3.0;
                    fVar166 = fVar167 * fVar167 * 3.0;
                    auVar203._0_4_ = fVar166 * fVar157;
                    auVar203._4_4_ = fVar166 * fVar158;
                    auVar203._8_4_ = fVar166 * fVar159;
                    auVar203._12_4_ = fVar166 * fVar65;
                    auVar210 = ZEXT1664(auVar203);
                    auVar175._4_4_ = fVar220;
                    auVar175._0_4_ = fVar220;
                    auVar175._8_4_ = fVar220;
                    auVar175._12_4_ = fVar220;
                    auVar80 = vfmadd132ps_fma(auVar175,auVar203,auVar87);
                    auVar184._4_4_ = fVar219;
                    auVar184._0_4_ = fVar219;
                    auVar184._8_4_ = fVar219;
                    auVar184._12_4_ = fVar219;
                    auVar80 = vfmadd132ps_fma(auVar184,auVar80,auVar86);
                    auVar176._4_4_ = fVar218;
                    auVar176._0_4_ = fVar218;
                    auVar176._8_4_ = fVar218;
                    auVar176._12_4_ = fVar218;
                    auVar80 = vfmadd132ps_fma(auVar176,auVar80,auVar21);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar68 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar80._0_4_;
                    uVar9 = vextractps_avx(auVar80,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                    uVar9 = vextractps_avx(auVar80,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar9;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar167;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar141;
                    *(uint *)(ray + k * 4 + 0x220) = uVar7;
                    *(uint *)(ray + k * 4 + 0x240) = uVar74;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01bf14d9;
      }
LAB_01bf0b85:
      uVar141 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar31._4_4_ = uVar141;
      auVar31._0_4_ = uVar141;
      auVar31._8_4_ = uVar141;
      auVar31._12_4_ = uVar141;
      uVar160 = vcmpps_avx512vl(local_2d0,auVar31,2);
      uVar74 = (uint)uVar75 & (uint)uVar75 + 0xf & (uint)uVar160;
      uVar75 = (ulong)uVar74;
    } while (uVar74 != 0);
  }
  return;
LAB_01bf188c:
  auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar236 = ZEXT1664(auVar80);
  auVar237 = ZEXT464(0xbf800000);
  auVar80 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
  auVar238 = ZEXT1664(auVar80);
LAB_01bf14d9:
  lVar72 = lVar72 + 8;
  if (iVar8 <= (int)lVar72) goto LAB_01bf0b85;
  goto LAB_01bf0c31;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }